

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O0

optional<tinyusdz::Prim> *
tinyusdz::detail::ReconstructPrimFromPrimSpec
          (optional<tinyusdz::Prim> *__return_storage_ptr__,PrimSpec *primspec,string *warn,
          string *err)

{
  pointer pTVar1;
  bool bVar2;
  __type _Var3;
  string *psVar4;
  PrimMeta *pPVar5;
  Specifier *pSVar6;
  string *psVar7;
  ostream *poVar8;
  string asStack_381d8 [32];
  ostringstream aoStack_381b8 [8];
  ostringstream ss_w;
  undefined1 auStack_38040 [8];
  Prim prim_23;
  Value primdata_23;
  string asStack_37cd0 [32];
  ostringstream aoStack_37cb0 [8];
  ostringstream ss_e_23;
  PrimReconstructOptions PStack_37b31;
  undefined1 auStack_37b30 [8];
  Material typed_prim_23;
  undefined1 auStack_36d50 [8];
  Prim prim_22;
  Value primdata_22;
  string asStack_369e0 [32];
  ostringstream aoStack_369c0 [8];
  ostringstream ss_e_22;
  PrimReconstructOptions PStack_36841;
  undefined1 auStack_36840 [8];
  Shader typed_prim_22;
  undefined1 auStack_360b8 [8];
  Prim prim_21;
  Value primdata_21;
  string asStack_35d48 [32];
  ostringstream aoStack_35d28 [8];
  ostringstream ss_e_21;
  PrimReconstructOptions PStack_35ba9;
  undefined1 auStack_35ba8 [8];
  BlendShape typed_prim_21;
  undefined1 auStack_34fa0 [8];
  Prim prim_20;
  Value primdata_20;
  string asStack_34c30 [32];
  ostringstream aoStack_34c10 [8];
  ostringstream ss_e_20;
  PrimReconstructOptions PStack_34a91;
  undefined1 auStack_34a90 [8];
  SkelAnimation typed_prim_20;
  undefined1 auStack_336f8 [8];
  Prim prim_19;
  Value primdata_19;
  string asStack_33388 [32];
  ostringstream aoStack_33368 [8];
  ostringstream ss_e_19;
  PrimReconstructOptions PStack_331e9;
  undefined1 auStack_331e8 [8];
  Skeleton typed_prim_19;
  undefined1 auStack_31598 [8];
  Prim prim_18;
  Value primdata_18;
  string asStack_31228 [32];
  ostringstream aoStack_31208 [8];
  ostringstream ss_e_18;
  PrimReconstructOptions PStack_31089;
  undefined1 auStack_31088 [8];
  SkelRoot typed_prim_18;
  undefined1 auStack_30088 [8];
  Prim prim_17;
  Value primdata_17;
  string asStack_2fd18 [32];
  ostringstream aoStack_2fcf8 [8];
  ostringstream ss_e_17;
  PrimReconstructOptions PStack_2fb79;
  undefined1 auStack_2fb78 [8];
  DistantLight typed_prim_17;
  undefined1 auStack_2d9e0 [8];
  Prim prim_16;
  Value primdata_16;
  string asStack_2d670 [32];
  ostringstream aoStack_2d650 [8];
  ostringstream ss_e_16;
  PrimReconstructOptions PStack_2d4d1;
  undefined1 auStack_2d4d0 [8];
  DiskLight typed_prim_16;
  undefined1 auStack_2b0c0 [8];
  Prim prim_15;
  Value primdata_15;
  string asStack_2ad50 [32];
  ostringstream aoStack_2ad30 [8];
  ostringstream ss_e_15;
  PrimReconstructOptions PStack_2abb1;
  undefined1 auStack_2abb0 [8];
  CylinderLight typed_prim_15;
  undefined1 auStack_28518 [8];
  Prim prim_14;
  Value primdata_14;
  string asStack_281a8 [32];
  ostringstream aoStack_28188 [8];
  ostringstream ss_e_14;
  PrimReconstructOptions PStack_28009;
  undefined1 auStack_28008 [8];
  DomeLight typed_prim_14;
  undefined1 auStack_25948 [8];
  Prim prim_13;
  Value primdata_13;
  string asStack_255d8 [32];
  ostringstream aoStack_255b8 [8];
  ostringstream ss_e_13;
  PrimReconstructOptions PStack_25439;
  undefined1 auStack_25438 [8];
  SphereLight typed_prim_13;
  undefined1 auStack_23028 [8];
  Prim prim_12;
  Value primdata_12;
  string asStack_22cb8 [32];
  ostringstream aoStack_22c98 [8];
  ostringstream ss_e_12;
  PrimReconstructOptions PStack_22b19;
  undefined1 auStack_22b18 [8];
  GeomCamera typed_prim_12;
  undefined1 auStack_1e950 [8];
  Prim prim_11;
  Value primdata_11;
  string asStack_1e5e0 [32];
  ostringstream aoStack_1e5c0 [8];
  ostringstream ss_e_11;
  PrimReconstructOptions PStack_1e441;
  undefined1 auStack_1e440 [8];
  GeomBasisCurves typed_prim_11;
  undefined1 auStack_1b040 [8];
  Prim prim_10;
  Value primdata_10;
  string asStack_1acd0 [32];
  ostringstream aoStack_1acb0 [8];
  ostringstream ss_e_10;
  PrimReconstructOptions PStack_1ab31;
  undefined1 auStack_1ab30 [8];
  GeomCapsule typed_prim_10;
  undefined1 auStack_18540 [8];
  Prim prim_9;
  Value primdata_9;
  string asStack_181d0 [32];
  ostringstream aoStack_181b0 [8];
  ostringstream ss_e_9;
  PrimReconstructOptions PStack_18031;
  undefined1 auStack_18030 [8];
  GeomSphere typed_prim_9;
  undefined1 auStack_15f10 [8];
  Prim prim_8;
  Value primdata_8;
  string asStack_15ba0 [32];
  ostringstream aoStack_15b80 [8];
  ostringstream ss_e_8;
  PrimReconstructOptions PStack_15a01;
  undefined1 auStack_15a00 [8];
  GeomCone typed_prim_8;
  undefined1 auStack_13410 [8];
  Prim prim_7;
  Value primdata_7;
  string asStack_130a0 [32];
  ostringstream aoStack_13080 [8];
  ostringstream ss_e_7;
  PrimReconstructOptions PStack_12f01;
  undefined1 auStack_12f00 [8];
  GeomCube typed_prim_7;
  undefined1 auStack_10de0 [8];
  Prim prim_6;
  Value primdata_6;
  string asStack_10a70 [32];
  ostringstream aoStack_10a50 [8];
  ostringstream ss_e_6;
  PrimReconstructOptions PStack_108d1;
  undefined1 auStack_108d0 [8];
  GeomCylinder typed_prim_6;
  undefined1 local_e2e0 [8];
  Prim prim_5;
  Value primdata_5;
  string local_df70 [32];
  ostringstream local_df50 [8];
  ostringstream ss_e_5;
  PrimReconstructOptions local_ddd1;
  undefined1 local_ddd0 [8];
  GeomPoints typed_prim_5;
  undefined1 local_b078 [8];
  Prim prim_4;
  Value primdata_4;
  string local_ad08 [32];
  ostringstream local_ace8 [8];
  ostringstream ss_e_4;
  PrimReconstructOptions local_ab69;
  undefined1 local_ab68 [8];
  GeomMesh typed_prim_4;
  undefined1 local_61d0 [8];
  Prim prim_3;
  Value primdata_3;
  string local_5e60 [32];
  ostringstream local_5e40 [8];
  ostringstream ss_e_3;
  PrimReconstructOptions local_5cc1;
  undefined1 local_5cc0 [8];
  Scope typed_prim_3;
  undefined1 local_4b80 [8];
  Prim prim_2;
  Value primdata_2;
  string local_4810 [32];
  ostringstream local_47f0 [8];
  ostringstream ss_e_2;
  PrimReconstructOptions local_4671;
  undefined1 local_4670 [8];
  Model typed_prim_2;
  undefined1 local_3790 [8];
  Prim prim_1;
  Value primdata_1;
  string local_3420 [32];
  ostringstream local_3400 [8];
  ostringstream ss_e_1;
  PrimReconstructOptions local_3281;
  undefined1 local_3280 [8];
  Xform typed_prim_1;
  undefined1 local_13f8 [8];
  Prim prim;
  Value primdata;
  string local_1088 [32];
  ostringstream local_1068 [8];
  ostringstream ss_e;
  PrimReconstructOptions local_ee9;
  undefined1 local_ee8 [8];
  Model typed_prim;
  string *err_local;
  string *warn_local;
  PrimSpec *primspec_local;
  
  typed_prim._properties.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)err;
  psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
  bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            psVar4,"Model");
  if (bVar2) {
    Model::Model((Model *)local_ee8);
    pTVar1 = typed_prim._properties.
             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    memset(&local_ee9,0,1);
    tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions(&local_ee9);
    bVar2 = tinyusdz::prim::ReconstructPrim<tinyusdz::Model>
                      (primspec,(Model *)local_ee8,warn,&pTVar1->str_,&local_ee9);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      pPVar5 = PrimSpec::metas(primspec);
      PrimMetas::operator=((PrimMetas *)&typed_prim.parent_id,pPVar5);
      psVar4 = PrimSpec::name_abi_cxx11_(primspec);
      ::std::__cxx11::string::operator=
                ((string *)
                 &typed_prim.super_MaterialBinding._materialBindingCollectionMap._M_t._M_impl.
                  super__Rb_tree_header._M_node_count,(string *)psVar4);
      psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
      ::std::__cxx11::string::operator=
                ((string *)(typed_prim.name.field_2._M_local_buf + 8),(string *)psVar4);
      pSVar6 = PrimSpec::specifier(primspec);
      typed_prim.prim_type_name.field_2._8_4_ = *pSVar6;
      tinyusdz::value::Value::Value<tinyusdz::Model>
                ((Value *)&prim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (Model *)local_ee8);
      psVar4 = PrimSpec::name_abi_cxx11_(primspec);
      Prim::Prim((Prim *)local_13f8,psVar4,
                 (Value *)&prim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
      psVar7 = Prim::prim_type_name_abi_cxx11_((Prim *)local_13f8);
      ::std::__cxx11::string::operator=((string *)psVar7,(string *)psVar4);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                (__return_storage_ptr__,(Prim *)local_13f8);
      Prim::~Prim((Prim *)local_13f8);
      tinyusdz::value::Value::~Value
                ((Value *)&prim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1068);
      poVar8 = ::std::operator<<((ostream *)local_1068,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ReconstructPrimFromPrimSpec");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x47c);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_1068,"Failed to reconstruct Model");
      ::std::operator<<(poVar8,"\n");
      if (typed_prim._properties.
          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=
                  ((string *)
                   typed_prim._properties.
                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,local_1088);
        ::std::__cxx11::string::~string(local_1088);
      }
      ::std::__cxx11::ostringstream::~ostringstream(local_1068);
      nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
    }
    Model::~Model((Model *)local_ee8);
  }
  else {
    psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
    tinyusdz::value::TypeTraits<tinyusdz::Xform>::type_name_abi_cxx11_();
    _Var3 = ::std::operator==(psVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&typed_prim_1.super_GPrim._variantSetMap._M_t._M_impl.
                                         super__Rb_tree_header._M_node_count);
    ::std::__cxx11::string::~string
              ((string *)
               &typed_prim_1.super_GPrim._variantSetMap._M_t._M_impl.super__Rb_tree_header.
                _M_node_count);
    if (_Var3) {
      Xform::Xform((Xform *)local_3280);
      pTVar1 = typed_prim._properties.
               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      memset(&local_3281,0,1);
      tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions(&local_3281);
      bVar2 = tinyusdz::prim::ReconstructPrim<tinyusdz::Xform>
                        (primspec,(Xform *)local_3280,warn,&pTVar1->str_,&local_3281);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        pPVar5 = PrimSpec::metas(primspec);
        PrimMetas::operator=
                  ((PrimMetas *)
                   &typed_prim_1.super_GPrim.variantSet._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count,pPVar5);
        psVar4 = PrimSpec::name_abi_cxx11_(primspec);
        ::std::__cxx11::string::operator=
                  ((string *)
                   ((long)&typed_prim_1.super_GPrim.super_Collection._instances._m._M_t._M_impl +
                   0x28),(string *)psVar4);
        pSVar6 = PrimSpec::specifier(primspec);
        typed_prim_1.super_GPrim.name.field_2._8_4_ = *pSVar6;
        tinyusdz::value::Value::Value<tinyusdz::Xform>
                  ((Value *)&prim_1._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (Xform *)local_3280);
        psVar4 = PrimSpec::name_abi_cxx11_(primspec);
        Prim::Prim((Prim *)local_3790,psVar4,
                   (Value *)&prim_1._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
        psVar7 = Prim::prim_type_name_abi_cxx11_((Prim *)local_3790);
        ::std::__cxx11::string::operator=((string *)psVar7,(string *)psVar4);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                  (__return_storage_ptr__,(Prim *)local_3790);
        Prim::~Prim((Prim *)local_3790);
        tinyusdz::value::Value::~Value
                  ((Value *)&prim_1._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_3400);
        poVar8 = ::std::operator<<((ostream *)local_3400,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"ReconstructPrimFromPrimSpec");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x48d);
        ::std::operator<<(poVar8," ");
        poVar8 = ::std::operator<<((ostream *)local_3400,"Failed to reconstruct Prim from PrimSpec "
                                  );
        psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
        poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
        poVar8 = ::std::operator<<(poVar8," elementName: ");
        psVar4 = PrimSpec::name_abi_cxx11_(primspec);
        poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
        ::std::operator<<(poVar8,"\n");
        if (typed_prim._properties.
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=
                    ((string *)
                     typed_prim._properties.
                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,local_3420);
          ::std::__cxx11::string::~string(local_3420);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_3400);
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
      }
      Xform::~Xform((Xform *)local_3280);
    }
    else {
      psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
      tinyusdz::value::TypeTraits<tinyusdz::Model>::type_name_abi_cxx11_();
      _Var3 = ::std::operator==(psVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&typed_prim_2._properties.
                                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &typed_prim_2._properties.
                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (_Var3) {
        Model::Model((Model *)local_4670);
        pTVar1 = typed_prim._properties.
                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        memset(&local_4671,0,1);
        tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions(&local_4671);
        bVar2 = tinyusdz::prim::ReconstructPrim<tinyusdz::Model>
                          (primspec,(Model *)local_4670,warn,&pTVar1->str_,&local_4671);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          pPVar5 = PrimSpec::metas(primspec);
          PrimMetas::operator=((PrimMetas *)&typed_prim_2.parent_id,pPVar5);
          psVar4 = PrimSpec::name_abi_cxx11_(primspec);
          ::std::__cxx11::string::operator=
                    ((string *)
                     &typed_prim_2.super_MaterialBinding._materialBindingCollectionMap._M_t._M_impl.
                      super__Rb_tree_header._M_node_count,(string *)psVar4);
          pSVar6 = PrimSpec::specifier(primspec);
          typed_prim_2.prim_type_name.field_2._8_4_ = *pSVar6;
          tinyusdz::value::Value::Value<tinyusdz::Model>
                    ((Value *)&prim_2._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (Model *)local_4670);
          psVar4 = PrimSpec::name_abi_cxx11_(primspec);
          Prim::Prim((Prim *)local_4b80,psVar4,
                     (Value *)&prim_2._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count)
          ;
          psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
          psVar7 = Prim::prim_type_name_abi_cxx11_((Prim *)local_4b80);
          ::std::__cxx11::string::operator=((string *)psVar7,(string *)psVar4);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4b80);
          Prim::~Prim((Prim *)local_4b80);
          tinyusdz::value::Value::~Value
                    ((Value *)&prim_2._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count)
          ;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_47f0);
          poVar8 = ::std::operator<<((ostream *)local_47f0,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReconstructPrimFromPrimSpec");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x48e);
          ::std::operator<<(poVar8," ");
          poVar8 = ::std::operator<<((ostream *)local_47f0,
                                     "Failed to reconstruct Prim from PrimSpec ");
          psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
          poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
          poVar8 = ::std::operator<<(poVar8," elementName: ");
          psVar4 = PrimSpec::name_abi_cxx11_(primspec);
          poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
          ::std::operator<<(poVar8,"\n");
          if (typed_prim._properties.
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=
                      ((string *)
                       typed_prim._properties.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage,local_4810);
            ::std::__cxx11::string::~string(local_4810);
          }
          ::std::__cxx11::ostringstream::~ostringstream(local_47f0);
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
        }
        Model::~Model((Model *)local_4670);
      }
      else {
        psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
        tinyusdz::value::TypeTraits<tinyusdz::Scope>::type_name_abi_cxx11_();
        _Var3 = ::std::operator==(psVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&typed_prim_3._properties.
                                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::__cxx11::string::~string
                  ((string *)
                   &typed_prim_3._properties.
                    super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        if (_Var3) {
          Scope::Scope((Scope *)local_5cc0);
          pTVar1 = typed_prim._properties.
                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          memset(&local_5cc1,0,1);
          tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions(&local_5cc1);
          bVar2 = tinyusdz::prim::ReconstructPrim<tinyusdz::Scope>
                            (primspec,(Scope *)local_5cc0,warn,&pTVar1->str_,&local_5cc1);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            pPVar5 = PrimSpec::metas(primspec);
            PrimMetas::operator=((PrimMetas *)&typed_prim_3.parent_id,pPVar5);
            psVar4 = PrimSpec::name_abi_cxx11_(primspec);
            ::std::__cxx11::string::operator=
                      ((string *)
                       &typed_prim_3.super_MaterialBinding._materialBindingCollectionMap._M_t.
                        _M_impl.super__Rb_tree_header._M_node_count,(string *)psVar4);
            pSVar6 = PrimSpec::specifier(primspec);
            typed_prim_3.name.field_2._8_4_ = *pSVar6;
            tinyusdz::value::Value::Value<tinyusdz::Scope>
                      ((Value *)&prim_3._variantSets._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count,(Scope *)local_5cc0);
            psVar4 = PrimSpec::name_abi_cxx11_(primspec);
            Prim::Prim((Prim *)local_61d0,psVar4,
                       (Value *)&prim_3._variantSets._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count);
            psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
            psVar7 = Prim::prim_type_name_abi_cxx11_((Prim *)local_61d0);
            ::std::__cxx11::string::operator=((string *)psVar7,(string *)psVar4);
            nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                      (__return_storage_ptr__,(Prim *)local_61d0);
            Prim::~Prim((Prim *)local_61d0);
            tinyusdz::value::Value::~Value
                      ((Value *)&prim_3._variantSets._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_5e40);
            poVar8 = ::std::operator<<((ostream *)local_5e40,"[error]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"ReconstructPrimFromPrimSpec");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x48f);
            ::std::operator<<(poVar8," ");
            poVar8 = ::std::operator<<((ostream *)local_5e40,
                                       "Failed to reconstruct Prim from PrimSpec ");
            psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
            poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
            poVar8 = ::std::operator<<(poVar8," elementName: ");
            psVar4 = PrimSpec::name_abi_cxx11_(primspec);
            poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
            ::std::operator<<(poVar8,"\n");
            if (typed_prim._properties.
                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=
                        ((string *)
                         typed_prim._properties.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,local_5e60);
              ::std::__cxx11::string::~string(local_5e60);
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_5e40);
            nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
          }
          Scope::~Scope((Scope *)local_5cc0);
        }
        else {
          psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
          tinyusdz::value::TypeTraits<tinyusdz::GeomMesh>::type_name_abi_cxx11_();
          _Var3 = ::std::operator==(psVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&typed_prim_4.subsetFamilyTypeMap._M_t._M_impl.
                                               super__Rb_tree_header._M_node_count);
          ::std::__cxx11::string::~string
                    ((string *)
                     &typed_prim_4.subsetFamilyTypeMap._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
          if (_Var3) {
            GeomMesh::GeomMesh((GeomMesh *)local_ab68);
            pTVar1 = typed_prim._properties.
                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            memset(&local_ab69,0,1);
            tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions(&local_ab69);
            bVar2 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomMesh>
                              (primspec,(GeomMesh *)local_ab68,warn,&pTVar1->str_,&local_ab69);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              pPVar5 = PrimSpec::metas(primspec);
              PrimMetas::operator=
                        ((PrimMetas *)
                         &typed_prim_4.super_GPrim.variantSet._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count,pPVar5);
              psVar4 = PrimSpec::name_abi_cxx11_(primspec);
              ::std::__cxx11::string::operator=
                        ((string *)
                         ((long)&typed_prim_4.super_GPrim.super_Collection._instances._m._M_t.
                                 _M_impl + 0x28),(string *)psVar4);
              pSVar6 = PrimSpec::specifier(primspec);
              typed_prim_4.super_GPrim.name.field_2._8_4_ = *pSVar6;
              tinyusdz::value::Value::Value<tinyusdz::GeomMesh>
                        ((Value *)&prim_4._variantSets._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count,(GeomMesh *)local_ab68);
              psVar4 = PrimSpec::name_abi_cxx11_(primspec);
              Prim::Prim((Prim *)local_b078,psVar4,
                         (Value *)&prim_4._variantSets._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count);
              psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
              psVar7 = Prim::prim_type_name_abi_cxx11_((Prim *)local_b078);
              ::std::__cxx11::string::operator=((string *)psVar7,(string *)psVar4);
              nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                        (__return_storage_ptr__,(Prim *)local_b078);
              Prim::~Prim((Prim *)local_b078);
              tinyusdz::value::Value::~Value
                        ((Value *)&prim_4._variantSets._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_ace8);
              poVar8 = ::std::operator<<((ostream *)local_ace8,"[error]");
              poVar8 = ::std::operator<<(poVar8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                        );
              poVar8 = ::std::operator<<(poVar8,":");
              poVar8 = ::std::operator<<(poVar8,"ReconstructPrimFromPrimSpec");
              poVar8 = ::std::operator<<(poVar8,"():");
              poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x490);
              ::std::operator<<(poVar8," ");
              poVar8 = ::std::operator<<((ostream *)local_ace8,
                                         "Failed to reconstruct Prim from PrimSpec ");
              psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
              poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
              poVar8 = ::std::operator<<(poVar8," elementName: ");
              psVar4 = PrimSpec::name_abi_cxx11_(primspec);
              poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
              ::std::operator<<(poVar8,"\n");
              if (typed_prim._properties.
                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::__cxx11::string::operator+=
                          ((string *)
                           typed_prim._properties.
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,local_ad08);
                ::std::__cxx11::string::~string(local_ad08);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_ace8);
              nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
            }
            GeomMesh::~GeomMesh((GeomMesh *)local_ab68);
          }
          else {
            psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
            tinyusdz::value::TypeTraits<tinyusdz::GeomPoints>::type_name_abi_cxx11_();
            _Var3 = ::std::operator==(psVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&typed_prim_5.accelerations._blocked);
            ::std::__cxx11::string::~string((string *)&typed_prim_5.accelerations._blocked);
            if (_Var3) {
              GeomPoints::GeomPoints((GeomPoints *)local_ddd0);
              pTVar1 = typed_prim._properties.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage;
              memset(&local_ddd1,0,1);
              tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions(&local_ddd1);
              bVar2 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomPoints>
                                (primspec,(GeomPoints *)local_ddd0,warn,&pTVar1->str_,&local_ddd1);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                pPVar5 = PrimSpec::metas(primspec);
                PrimMetas::operator=
                          ((PrimMetas *)
                           &typed_prim_5.super_GPrim.variantSet._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,pPVar5);
                psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                ::std::__cxx11::string::operator=
                          ((string *)
                           ((long)&typed_prim_5.super_GPrim.super_Collection._instances._m._M_t.
                                   _M_impl + 0x28),(string *)psVar4);
                pSVar6 = PrimSpec::specifier(primspec);
                typed_prim_5.super_GPrim.name.field_2._8_4_ = *pSVar6;
                tinyusdz::value::Value::Value<tinyusdz::GeomPoints>
                          ((Value *)&prim_5._variantSets._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count,(GeomPoints *)local_ddd0);
                psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                Prim::Prim((Prim *)local_e2e0,psVar4,
                           (Value *)&prim_5._variantSets._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count);
                psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                psVar7 = Prim::prim_type_name_abi_cxx11_((Prim *)local_e2e0);
                ::std::__cxx11::string::operator=((string *)psVar7,(string *)psVar4);
                nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                          (__return_storage_ptr__,(Prim *)local_e2e0);
                Prim::~Prim((Prim *)local_e2e0);
                tinyusdz::value::Value::~Value
                          ((Value *)&prim_5._variantSets._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_df50);
                poVar8 = ::std::operator<<((ostream *)local_df50,"[error]");
                poVar8 = ::std::operator<<(poVar8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                          );
                poVar8 = ::std::operator<<(poVar8,":");
                poVar8 = ::std::operator<<(poVar8,"ReconstructPrimFromPrimSpec");
                poVar8 = ::std::operator<<(poVar8,"():");
                poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x491);
                ::std::operator<<(poVar8," ");
                poVar8 = ::std::operator<<((ostream *)local_df50,
                                           "Failed to reconstruct Prim from PrimSpec ");
                psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                poVar8 = ::std::operator<<(poVar8," elementName: ");
                psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                ::std::operator<<(poVar8,"\n");
                if (typed_prim._properties.
                    super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=
                            ((string *)
                             typed_prim._properties.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,local_df70);
                  ::std::__cxx11::string::~string(local_df70);
                }
                ::std::__cxx11::ostringstream::~ostringstream(local_df50);
                nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
              }
              GeomPoints::~GeomPoints((GeomPoints *)local_ddd0);
            }
            else {
              psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
              tinyusdz::value::TypeTraits<tinyusdz::GeomCylinder>::type_name_abi_cxx11_();
              _Var3 = ::std::operator==(psVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&typed_prim_6.axis._blocked);
              ::std::__cxx11::string::~string((string *)&typed_prim_6.axis._blocked);
              if (_Var3) {
                GeomCylinder::GeomCylinder((GeomCylinder *)auStack_108d0);
                pTVar1 = typed_prim._properties.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
                memset(&PStack_108d1,0,1);
                tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions(&PStack_108d1);
                bVar2 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCylinder>
                                  (primspec,(GeomCylinder *)auStack_108d0,warn,&pTVar1->str_,
                                   &PStack_108d1);
                if (((bVar2 ^ 0xffU) & 1) == 0) {
                  pPVar5 = PrimSpec::metas(primspec);
                  PrimMetas::operator=
                            ((PrimMetas *)
                             &typed_prim_6.super_GPrim.variantSet._M_t._M_impl.super__Rb_tree_header
                              ._M_node_count,pPVar5);
                  psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                  ::std::__cxx11::string::operator=
                            ((string *)
                             ((long)&typed_prim_6.super_GPrim.super_Collection._instances._m._M_t.
                                     _M_impl + 0x28),(string *)psVar4);
                  pSVar6 = PrimSpec::specifier(primspec);
                  typed_prim_6.super_GPrim.name.field_2._8_4_ = *pSVar6;
                  tinyusdz::value::Value::Value<tinyusdz::GeomCylinder>
                            ((Value *)&prim_6._variantSets._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count,(GeomCylinder *)auStack_108d0);
                  psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                  Prim::Prim((Prim *)auStack_10de0,psVar4,
                             (Value *)&prim_6._variantSets._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
                  psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                  psVar7 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_10de0);
                  ::std::__cxx11::string::operator=((string *)psVar7,(string *)psVar4);
                  nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                            (__return_storage_ptr__,(Prim *)auStack_10de0);
                  Prim::~Prim((Prim *)auStack_10de0);
                  tinyusdz::value::Value::~Value
                            ((Value *)&prim_6._variantSets._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(aoStack_10a50);
                  poVar8 = ::std::operator<<((ostream *)aoStack_10a50,"[error]");
                  poVar8 = ::std::operator<<(poVar8,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                            );
                  poVar8 = ::std::operator<<(poVar8,":");
                  poVar8 = ::std::operator<<(poVar8,"ReconstructPrimFromPrimSpec");
                  poVar8 = ::std::operator<<(poVar8,"():");
                  poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x492);
                  ::std::operator<<(poVar8," ");
                  poVar8 = ::std::operator<<((ostream *)aoStack_10a50,
                                             "Failed to reconstruct Prim from PrimSpec ");
                  psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                  poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                  poVar8 = ::std::operator<<(poVar8," elementName: ");
                  psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                  poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                  ::std::operator<<(poVar8,"\n");
                  if (typed_prim._properties.
                      super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                    ::std::__cxx11::ostringstream::str();
                    ::std::__cxx11::string::operator+=
                              ((string *)
                               typed_prim._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,asStack_10a70);
                    ::std::__cxx11::string::~string(asStack_10a70);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream(aoStack_10a50);
                  nonstd::optional_lite::optional<tinyusdz::Prim>::optional(__return_storage_ptr__);
                }
                GeomCylinder::~GeomCylinder((GeomCylinder *)auStack_108d0);
              }
              else {
                psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                tinyusdz::value::TypeTraits<tinyusdz::GeomCube>::type_name_abi_cxx11_();
                _Var3 = ::std::operator==(psVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&typed_prim_7.size._blocked);
                ::std::__cxx11::string::~string((string *)&typed_prim_7.size._blocked);
                if (_Var3) {
                  GeomCube::GeomCube((GeomCube *)auStack_12f00);
                  pTVar1 = typed_prim._properties.
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
                  memset(&PStack_12f01,0,1);
                  tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions(&PStack_12f01);
                  bVar2 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCube>
                                    (primspec,(GeomCube *)auStack_12f00,warn,&pTVar1->str_,
                                     &PStack_12f01);
                  if (((bVar2 ^ 0xffU) & 1) == 0) {
                    pPVar5 = PrimSpec::metas(primspec);
                    PrimMetas::operator=
                              ((PrimMetas *)
                               &typed_prim_7.super_GPrim.variantSet._M_t._M_impl.
                                super__Rb_tree_header._M_node_count,pPVar5);
                    psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                    ::std::__cxx11::string::operator=
                              ((string *)
                               ((long)&typed_prim_7.super_GPrim.super_Collection._instances._m._M_t.
                                       _M_impl + 0x28),(string *)psVar4);
                    pSVar6 = PrimSpec::specifier(primspec);
                    typed_prim_7.super_GPrim.name.field_2._8_4_ = *pSVar6;
                    tinyusdz::value::Value::Value<tinyusdz::GeomCube>
                              ((Value *)&prim_7._variantSets._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count,(GeomCube *)auStack_12f00);
                    psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                    Prim::Prim((Prim *)auStack_13410,psVar4,
                               (Value *)&prim_7._variantSets._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count);
                    psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                    psVar7 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_13410);
                    ::std::__cxx11::string::operator=((string *)psVar7,(string *)psVar4);
                    nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                              (__return_storage_ptr__,(Prim *)auStack_13410);
                    Prim::~Prim((Prim *)auStack_13410);
                    tinyusdz::value::Value::~Value
                              ((Value *)&prim_7._variantSets._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count);
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream(aoStack_13080);
                    poVar8 = ::std::operator<<((ostream *)aoStack_13080,"[error]");
                    poVar8 = ::std::operator<<(poVar8,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                              );
                    poVar8 = ::std::operator<<(poVar8,":");
                    poVar8 = ::std::operator<<(poVar8,"ReconstructPrimFromPrimSpec");
                    poVar8 = ::std::operator<<(poVar8,"():");
                    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x493);
                    ::std::operator<<(poVar8," ");
                    poVar8 = ::std::operator<<((ostream *)aoStack_13080,
                                               "Failed to reconstruct Prim from PrimSpec ");
                    psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                    poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                    poVar8 = ::std::operator<<(poVar8," elementName: ");
                    psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                    poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                    ::std::operator<<(poVar8,"\n");
                    if (typed_prim._properties.
                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                      ::std::__cxx11::ostringstream::str();
                      ::std::__cxx11::string::operator+=
                                ((string *)
                                 typed_prim._properties.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,asStack_130a0);
                      ::std::__cxx11::string::~string(asStack_130a0);
                    }
                    ::std::__cxx11::ostringstream::~ostringstream(aoStack_13080);
                    nonstd::optional_lite::optional<tinyusdz::Prim>::optional
                              (__return_storage_ptr__);
                  }
                  GeomCube::~GeomCube((GeomCube *)auStack_12f00);
                }
                else {
                  psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                  tinyusdz::value::TypeTraits<tinyusdz::GeomCone>::type_name_abi_cxx11_();
                  _Var3 = ::std::operator==(psVar4,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&typed_prim_8.axis._blocked);
                  ::std::__cxx11::string::~string((string *)&typed_prim_8.axis._blocked);
                  if (_Var3) {
                    GeomCone::GeomCone((GeomCone *)auStack_15a00);
                    pTVar1 = typed_prim._properties.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                    memset(&PStack_15a01,0,1);
                    tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions(&PStack_15a01);
                    bVar2 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCone>
                                      (primspec,(GeomCone *)auStack_15a00,warn,&pTVar1->str_,
                                       &PStack_15a01);
                    if (((bVar2 ^ 0xffU) & 1) == 0) {
                      pPVar5 = PrimSpec::metas(primspec);
                      PrimMetas::operator=
                                ((PrimMetas *)
                                 &typed_prim_8.super_GPrim.variantSet._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count,pPVar5);
                      psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                      ::std::__cxx11::string::operator=
                                ((string *)
                                 ((long)&typed_prim_8.super_GPrim.super_Collection._instances._m.
                                         _M_t._M_impl + 0x28),(string *)psVar4);
                      pSVar6 = PrimSpec::specifier(primspec);
                      typed_prim_8.super_GPrim.name.field_2._8_4_ = *pSVar6;
                      tinyusdz::value::Value::Value<tinyusdz::GeomCone>
                                ((Value *)&prim_8._variantSets._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count,(GeomCone *)auStack_15a00);
                      psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                      Prim::Prim((Prim *)auStack_15f10,psVar4,
                                 (Value *)&prim_8._variantSets._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count);
                      psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                      psVar7 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_15f10);
                      ::std::__cxx11::string::operator=((string *)psVar7,(string *)psVar4);
                      nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                                (__return_storage_ptr__,(Prim *)auStack_15f10);
                      Prim::~Prim((Prim *)auStack_15f10);
                      tinyusdz::value::Value::~Value
                                ((Value *)&prim_8._variantSets._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count);
                    }
                    else {
                      ::std::__cxx11::ostringstream::ostringstream(aoStack_15b80);
                      poVar8 = ::std::operator<<((ostream *)aoStack_15b80,"[error]");
                      poVar8 = ::std::operator<<(poVar8,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                );
                      poVar8 = ::std::operator<<(poVar8,":");
                      poVar8 = ::std::operator<<(poVar8,"ReconstructPrimFromPrimSpec");
                      poVar8 = ::std::operator<<(poVar8,"():");
                      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x494);
                      ::std::operator<<(poVar8," ");
                      poVar8 = ::std::operator<<((ostream *)aoStack_15b80,
                                                 "Failed to reconstruct Prim from PrimSpec ");
                      psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                      poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                      poVar8 = ::std::operator<<(poVar8," elementName: ");
                      psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                      poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                      ::std::operator<<(poVar8,"\n");
                      if (typed_prim._properties.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                        ::std::__cxx11::ostringstream::str();
                        ::std::__cxx11::string::operator+=
                                  ((string *)
                                   typed_prim._properties.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,asStack_15ba0)
                        ;
                        ::std::__cxx11::string::~string(asStack_15ba0);
                      }
                      ::std::__cxx11::ostringstream::~ostringstream(aoStack_15b80);
                      nonstd::optional_lite::optional<tinyusdz::Prim>::optional
                                (__return_storage_ptr__);
                    }
                    GeomCone::~GeomCone((GeomCone *)auStack_15a00);
                  }
                  else {
                    psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                    tinyusdz::value::TypeTraits<tinyusdz::GeomSphere>::type_name_abi_cxx11_();
                    _Var3 = ::std::operator==(psVar4,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&typed_prim_9.radius._blocked);
                    ::std::__cxx11::string::~string((string *)&typed_prim_9.radius._blocked);
                    if (_Var3) {
                      GeomSphere::GeomSphere((GeomSphere *)auStack_18030);
                      pTVar1 = typed_prim._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      memset(&PStack_18031,0,1);
                      tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions(&PStack_18031);
                      bVar2 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomSphere>
                                        (primspec,(GeomSphere *)auStack_18030,warn,&pTVar1->str_,
                                         &PStack_18031);
                      if (((bVar2 ^ 0xffU) & 1) == 0) {
                        pPVar5 = PrimSpec::metas(primspec);
                        PrimMetas::operator=
                                  ((PrimMetas *)
                                   &typed_prim_9.super_GPrim.variantSet._M_t._M_impl.
                                    super__Rb_tree_header._M_node_count,pPVar5);
                        psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                        ::std::__cxx11::string::operator=
                                  ((string *)
                                   ((long)&typed_prim_9.super_GPrim.super_Collection._instances._m.
                                           _M_t._M_impl + 0x28),(string *)psVar4);
                        pSVar6 = PrimSpec::specifier(primspec);
                        typed_prim_9.super_GPrim.name.field_2._8_4_ = *pSVar6;
                        tinyusdz::value::Value::Value<tinyusdz::GeomSphere>
                                  ((Value *)&prim_9._variantSets._M_t._M_impl.super__Rb_tree_header.
                                             _M_node_count,(GeomSphere *)auStack_18030);
                        psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                        Prim::Prim((Prim *)auStack_18540,psVar4,
                                   (Value *)&prim_9._variantSets._M_t._M_impl.super__Rb_tree_header.
                                             _M_node_count);
                        psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                        psVar7 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_18540);
                        ::std::__cxx11::string::operator=((string *)psVar7,(string *)psVar4);
                        nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                                  (__return_storage_ptr__,(Prim *)auStack_18540);
                        Prim::~Prim((Prim *)auStack_18540);
                        tinyusdz::value::Value::~Value
                                  ((Value *)&prim_9._variantSets._M_t._M_impl.super__Rb_tree_header.
                                             _M_node_count);
                      }
                      else {
                        ::std::__cxx11::ostringstream::ostringstream(aoStack_181b0);
                        poVar8 = ::std::operator<<((ostream *)aoStack_181b0,"[error]");
                        poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                  );
                        poVar8 = ::std::operator<<(poVar8,":");
                        poVar8 = ::std::operator<<(poVar8,"ReconstructPrimFromPrimSpec");
                        poVar8 = ::std::operator<<(poVar8,"():");
                        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x495);
                        ::std::operator<<(poVar8," ");
                        poVar8 = ::std::operator<<((ostream *)aoStack_181b0,
                                                   "Failed to reconstruct Prim from PrimSpec ");
                        psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                        poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                        poVar8 = ::std::operator<<(poVar8," elementName: ");
                        psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                        poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                        ::std::operator<<(poVar8,"\n");
                        if (typed_prim._properties.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                          ::std::__cxx11::ostringstream::str();
                          ::std::__cxx11::string::operator+=
                                    ((string *)
                                     typed_prim._properties.
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     asStack_181d0);
                          ::std::__cxx11::string::~string(asStack_181d0);
                        }
                        ::std::__cxx11::ostringstream::~ostringstream(aoStack_181b0);
                        nonstd::optional_lite::optional<tinyusdz::Prim>::optional
                                  (__return_storage_ptr__);
                      }
                      GeomSphere::~GeomSphere((GeomSphere *)auStack_18030);
                    }
                    else {
                      psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                      tinyusdz::value::TypeTraits<tinyusdz::GeomCapsule>::type_name_abi_cxx11_();
                      _Var3 = ::std::operator==(psVar4,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&typed_prim_10.axis._blocked);
                      ::std::__cxx11::string::~string((string *)&typed_prim_10.axis._blocked);
                      if (_Var3) {
                        GeomCapsule::GeomCapsule((GeomCapsule *)auStack_1ab30);
                        pTVar1 = typed_prim._properties.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        memset(&PStack_1ab31,0,1);
                        tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions
                                  (&PStack_1ab31);
                        bVar2 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCapsule>
                                          (primspec,(GeomCapsule *)auStack_1ab30,warn,&pTVar1->str_,
                                           &PStack_1ab31);
                        if (((bVar2 ^ 0xffU) & 1) == 0) {
                          pPVar5 = PrimSpec::metas(primspec);
                          PrimMetas::operator=
                                    ((PrimMetas *)
                                     &typed_prim_10.super_GPrim.variantSet._M_t._M_impl.
                                      super__Rb_tree_header._M_node_count,pPVar5);
                          psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                          ::std::__cxx11::string::operator=
                                    ((string *)
                                     ((long)&typed_prim_10.super_GPrim.super_Collection._instances.
                                             _m._M_t._M_impl + 0x28),(string *)psVar4);
                          pSVar6 = PrimSpec::specifier(primspec);
                          typed_prim_10.super_GPrim.name.field_2._8_4_ = *pSVar6;
                          tinyusdz::value::Value::Value<tinyusdz::GeomCapsule>
                                    ((Value *)&prim_10._variantSets._M_t._M_impl.
                                               super__Rb_tree_header._M_node_count,
                                     (GeomCapsule *)auStack_1ab30);
                          psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                          Prim::Prim((Prim *)auStack_1b040,psVar4,
                                     (Value *)&prim_10._variantSets._M_t._M_impl.
                                               super__Rb_tree_header._M_node_count);
                          psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                          psVar7 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_1b040);
                          ::std::__cxx11::string::operator=((string *)psVar7,(string *)psVar4);
                          nonstd::optional_lite::optional<tinyusdz::Prim>::
                          optional<tinyusdz::Prim,_0>(__return_storage_ptr__,(Prim *)auStack_1b040);
                          Prim::~Prim((Prim *)auStack_1b040);
                          tinyusdz::value::Value::~Value
                                    ((Value *)&prim_10._variantSets._M_t._M_impl.
                                               super__Rb_tree_header._M_node_count);
                        }
                        else {
                          ::std::__cxx11::ostringstream::ostringstream(aoStack_1acb0);
                          poVar8 = ::std::operator<<((ostream *)aoStack_1acb0,"[error]");
                          poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                  );
                          poVar8 = ::std::operator<<(poVar8,":");
                          poVar8 = ::std::operator<<(poVar8,"ReconstructPrimFromPrimSpec");
                          poVar8 = ::std::operator<<(poVar8,"():");
                          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x496);
                          ::std::operator<<(poVar8," ");
                          poVar8 = ::std::operator<<((ostream *)aoStack_1acb0,
                                                     "Failed to reconstruct Prim from PrimSpec ");
                          psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                          poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                          poVar8 = ::std::operator<<(poVar8," elementName: ");
                          psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                          poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                          ::std::operator<<(poVar8,"\n");
                          if (typed_prim._properties.
                              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                            ::std::__cxx11::ostringstream::str();
                            ::std::__cxx11::string::operator+=
                                      ((string *)
                                       typed_prim._properties.
                                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       asStack_1acd0);
                            ::std::__cxx11::string::~string(asStack_1acd0);
                          }
                          ::std::__cxx11::ostringstream::~ostringstream(aoStack_1acb0);
                          nonstd::optional_lite::optional<tinyusdz::Prim>::optional
                                    (__return_storage_ptr__);
                        }
                        GeomCapsule::~GeomCapsule((GeomCapsule *)auStack_1ab30);
                      }
                      else {
                        psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                        tinyusdz::value::TypeTraits<tinyusdz::GeomBasisCurves>::type_name_abi_cxx11_
                                  ();
                        _Var3 = ::std::operator==(psVar4,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&typed_prim_11.accelerations._blocked);
                        ::std::__cxx11::string::~string
                                  ((string *)&typed_prim_11.accelerations._blocked);
                        if (_Var3) {
                          GeomBasisCurves::GeomBasisCurves((GeomBasisCurves *)auStack_1e440);
                          pTVar1 = typed_prim._properties.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
                          memset(&PStack_1e441,0,1);
                          tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions
                                    (&PStack_1e441);
                          bVar2 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomBasisCurves>
                                            (primspec,(GeomBasisCurves *)auStack_1e440,warn,
                                             &pTVar1->str_,&PStack_1e441);
                          if (((bVar2 ^ 0xffU) & 1) == 0) {
                            pPVar5 = PrimSpec::metas(primspec);
                            PrimMetas::operator=
                                      ((PrimMetas *)
                                       &typed_prim_11.super_GPrim.variantSet._M_t._M_impl.
                                        super__Rb_tree_header._M_node_count,pPVar5);
                            psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                            ::std::__cxx11::string::operator=
                                      ((string *)
                                       ((long)&typed_prim_11.super_GPrim.super_Collection._instances
                                               ._m._M_t._M_impl + 0x28),(string *)psVar4);
                            pSVar6 = PrimSpec::specifier(primspec);
                            typed_prim_11.super_GPrim.name.field_2._8_4_ = *pSVar6;
                            tinyusdz::value::Value::Value<tinyusdz::GeomBasisCurves>
                                      ((Value *)&prim_11._variantSets._M_t._M_impl.
                                                 super__Rb_tree_header._M_node_count,
                                       (GeomBasisCurves *)auStack_1e440);
                            psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                            Prim::Prim((Prim *)auStack_1e950,psVar4,
                                       (Value *)&prim_11._variantSets._M_t._M_impl.
                                                 super__Rb_tree_header._M_node_count);
                            psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                            psVar7 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_1e950);
                            ::std::__cxx11::string::operator=((string *)psVar7,(string *)psVar4);
                            nonstd::optional_lite::optional<tinyusdz::Prim>::
                            optional<tinyusdz::Prim,_0>
                                      (__return_storage_ptr__,(Prim *)auStack_1e950);
                            Prim::~Prim((Prim *)auStack_1e950);
                            tinyusdz::value::Value::~Value
                                      ((Value *)&prim_11._variantSets._M_t._M_impl.
                                                 super__Rb_tree_header._M_node_count);
                          }
                          else {
                            ::std::__cxx11::ostringstream::ostringstream(aoStack_1e5c0);
                            poVar8 = ::std::operator<<((ostream *)aoStack_1e5c0,"[error]");
                            poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                  );
                            poVar8 = ::std::operator<<(poVar8,":");
                            poVar8 = ::std::operator<<(poVar8,"ReconstructPrimFromPrimSpec");
                            poVar8 = ::std::operator<<(poVar8,"():");
                            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x497);
                            ::std::operator<<(poVar8," ");
                            poVar8 = ::std::operator<<((ostream *)aoStack_1e5c0,
                                                       "Failed to reconstruct Prim from PrimSpec ");
                            psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                            poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                            poVar8 = ::std::operator<<(poVar8," elementName: ");
                            psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                            poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                            ::std::operator<<(poVar8,"\n");
                            if (typed_prim._properties.
                                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0)
                            {
                              ::std::__cxx11::ostringstream::str();
                              ::std::__cxx11::string::operator+=
                                        ((string *)
                                         typed_prim._properties.
                                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         asStack_1e5e0);
                              ::std::__cxx11::string::~string(asStack_1e5e0);
                            }
                            ::std::__cxx11::ostringstream::~ostringstream(aoStack_1e5c0);
                            nonstd::optional_lite::optional<tinyusdz::Prim>::optional
                                      (__return_storage_ptr__);
                          }
                          GeomBasisCurves::~GeomBasisCurves((GeomBasisCurves *)auStack_1e440);
                        }
                        else {
                          psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                          tinyusdz::value::TypeTraits<tinyusdz::GeomCamera>::type_name_abi_cxx11_();
                          _Var3 = ::std::operator==(psVar4,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&typed_prim_12.shutterOpen._blocked);
                          ::std::__cxx11::string::~string
                                    ((string *)&typed_prim_12.shutterOpen._blocked);
                          if (_Var3) {
                            GeomCamera::GeomCamera((GeomCamera *)auStack_22b18);
                            pTVar1 = typed_prim._properties.
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                            memset(&PStack_22b19,0,1);
                            tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions
                                      (&PStack_22b19);
                            bVar2 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCamera>
                                              (primspec,(GeomCamera *)auStack_22b18,warn,
                                               &pTVar1->str_,&PStack_22b19);
                            if (((bVar2 ^ 0xffU) & 1) == 0) {
                              pPVar5 = PrimSpec::metas(primspec);
                              PrimMetas::operator=
                                        ((PrimMetas *)
                                         &typed_prim_12.super_GPrim.variantSet._M_t._M_impl.
                                          super__Rb_tree_header._M_node_count,pPVar5);
                              psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                              ::std::__cxx11::string::operator=
                                        ((string *)
                                         ((long)&typed_prim_12.super_GPrim.super_Collection.
                                                 _instances._m._M_t._M_impl + 0x28),(string *)psVar4
                                        );
                              pSVar6 = PrimSpec::specifier(primspec);
                              typed_prim_12.super_GPrim.name.field_2._8_4_ = *pSVar6;
                              tinyusdz::value::Value::Value<tinyusdz::GeomCamera>
                                        ((Value *)&prim_12._variantSets._M_t._M_impl.
                                                   super__Rb_tree_header._M_node_count,
                                         (GeomCamera *)auStack_22b18);
                              psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                              Prim::Prim((Prim *)auStack_23028,psVar4,
                                         (Value *)&prim_12._variantSets._M_t._M_impl.
                                                   super__Rb_tree_header._M_node_count);
                              psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                              psVar7 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_23028);
                              ::std::__cxx11::string::operator=((string *)psVar7,(string *)psVar4);
                              nonstd::optional_lite::optional<tinyusdz::Prim>::
                              optional<tinyusdz::Prim,_0>
                                        (__return_storage_ptr__,(Prim *)auStack_23028);
                              Prim::~Prim((Prim *)auStack_23028);
                              tinyusdz::value::Value::~Value
                                        ((Value *)&prim_12._variantSets._M_t._M_impl.
                                                   super__Rb_tree_header._M_node_count);
                            }
                            else {
                              ::std::__cxx11::ostringstream::ostringstream(aoStack_22c98);
                              poVar8 = ::std::operator<<((ostream *)aoStack_22c98,"[error]");
                              poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                  );
                              poVar8 = ::std::operator<<(poVar8,":");
                              poVar8 = ::std::operator<<(poVar8,"ReconstructPrimFromPrimSpec");
                              poVar8 = ::std::operator<<(poVar8,"():");
                              poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x498);
                              ::std::operator<<(poVar8," ");
                              poVar8 = ::std::operator<<((ostream *)aoStack_22c98,
                                                         "Failed to reconstruct Prim from PrimSpec "
                                                        );
                              psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                              poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                              poVar8 = ::std::operator<<(poVar8," elementName: ");
                              psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                              poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                              ::std::operator<<(poVar8,"\n");
                              if (typed_prim._properties.
                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0
                                 ) {
                                ::std::__cxx11::ostringstream::str();
                                ::std::__cxx11::string::operator+=
                                          ((string *)
                                           typed_prim._properties.
                                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                           asStack_22cb8);
                                ::std::__cxx11::string::~string(asStack_22cb8);
                              }
                              ::std::__cxx11::ostringstream::~ostringstream(aoStack_22c98);
                              nonstd::optional_lite::optional<tinyusdz::Prim>::optional
                                        (__return_storage_ptr__);
                            }
                            GeomCamera::~GeomCamera((GeomCamera *)auStack_22b18);
                          }
                          else {
                            psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                            tinyusdz::value::TypeTraits<tinyusdz::SphereLight>::type_name_abi_cxx11_
                                      ();
                            _Var3 = ::std::operator==(psVar4,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&typed_prim_13.radius._blocked);
                            ::std::__cxx11::string::~string
                                      ((string *)&typed_prim_13.radius._blocked);
                            if (_Var3) {
                              SphereLight::SphereLight((SphereLight *)auStack_25438);
                              pTVar1 = typed_prim._properties.
                                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                              memset(&PStack_25439,0,1);
                              tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions
                                        (&PStack_25439);
                              bVar2 = tinyusdz::prim::ReconstructPrim<tinyusdz::SphereLight>
                                                (primspec,(SphereLight *)auStack_25438,warn,
                                                 &pTVar1->str_,&PStack_25439);
                              if (((bVar2 ^ 0xffU) & 1) == 0) {
                                pPVar5 = PrimSpec::metas(primspec);
                                PrimMetas::operator=
                                          ((PrimMetas *)
                                           &typed_prim_13.super_BoundableLight.props._M_t._M_impl.
                                            super__Rb_tree_header._M_node_count,pPVar5);
                                psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                ::std::__cxx11::string::operator=
                                          ((string *)
                                           ((long)&typed_prim_13.super_BoundableLight.
                                                   super_Collection._instances._m._M_t._M_impl +
                                           0x28),(string *)psVar4);
                                pSVar6 = PrimSpec::specifier(primspec);
                                typed_prim_13.super_BoundableLight.name.field_2._8_4_ = *pSVar6;
                                tinyusdz::value::Value::Value<tinyusdz::SphereLight>
                                          ((Value *)&prim_13._variantSets._M_t._M_impl.
                                                     super__Rb_tree_header._M_node_count,
                                           (SphereLight *)auStack_25438);
                                psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                Prim::Prim((Prim *)auStack_25948,psVar4,
                                           (Value *)&prim_13._variantSets._M_t._M_impl.
                                                     super__Rb_tree_header._M_node_count);
                                psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                psVar7 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_25948);
                                ::std::__cxx11::string::operator=((string *)psVar7,(string *)psVar4)
                                ;
                                nonstd::optional_lite::optional<tinyusdz::Prim>::
                                optional<tinyusdz::Prim,_0>
                                          (__return_storage_ptr__,(Prim *)auStack_25948);
                                Prim::~Prim((Prim *)auStack_25948);
                                tinyusdz::value::Value::~Value
                                          ((Value *)&prim_13._variantSets._M_t._M_impl.
                                                     super__Rb_tree_header._M_node_count);
                              }
                              else {
                                ::std::__cxx11::ostringstream::ostringstream(aoStack_255b8);
                                poVar8 = ::std::operator<<((ostream *)aoStack_255b8,"[error]");
                                poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                  );
                                poVar8 = ::std::operator<<(poVar8,":");
                                poVar8 = ::std::operator<<(poVar8,"ReconstructPrimFromPrimSpec");
                                poVar8 = ::std::operator<<(poVar8,"():");
                                poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x49a);
                                ::std::operator<<(poVar8," ");
                                poVar8 = ::std::operator<<((ostream *)aoStack_255b8,
                                                                                                                      
                                                  "Failed to reconstruct Prim from PrimSpec ");
                                psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                                poVar8 = ::std::operator<<(poVar8," elementName: ");
                                psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                                ::std::operator<<(poVar8,"\n");
                                if (typed_prim._properties.
                                    super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                                    (pointer)0x0) {
                                  ::std::__cxx11::ostringstream::str();
                                  ::std::__cxx11::string::operator+=
                                            ((string *)
                                             typed_prim._properties.
                                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                             asStack_255d8);
                                  ::std::__cxx11::string::~string(asStack_255d8);
                                }
                                ::std::__cxx11::ostringstream::~ostringstream(aoStack_255b8);
                                nonstd::optional_lite::optional<tinyusdz::Prim>::optional
                                          (__return_storage_ptr__);
                              }
                              SphereLight::~SphereLight((SphereLight *)auStack_25438);
                            }
                            else {
                              psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                              tinyusdz::value::TypeTraits<tinyusdz::DomeLight>::type_name_abi_cxx11_
                                        ();
                              _Var3 = ::std::operator==(psVar4,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&typed_prim_14.textureFormat._blocked);
                              ::std::__cxx11::string::~string
                                        ((string *)&typed_prim_14.textureFormat._blocked);
                              if (_Var3) {
                                DomeLight::DomeLight((DomeLight *)auStack_28008);
                                pTVar1 = typed_prim._properties.
                                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                memset(&PStack_28009,0,1);
                                tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions
                                          (&PStack_28009);
                                bVar2 = tinyusdz::prim::ReconstructPrim<tinyusdz::DomeLight>
                                                  (primspec,(DomeLight *)auStack_28008,warn,
                                                   &pTVar1->str_,&PStack_28009);
                                if (((bVar2 ^ 0xffU) & 1) == 0) {
                                  pPVar5 = PrimSpec::metas(primspec);
                                  PrimMetas::operator=
                                            ((PrimMetas *)
                                             &typed_prim_14.super_NonboundableLight.props._M_t.
                                              _M_impl.super__Rb_tree_header._M_node_count,pPVar5);
                                  psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                  ::std::__cxx11::string::operator=
                                            ((string *)
                                             ((long)&typed_prim_14.super_NonboundableLight.
                                                     super_Collection._instances._m._M_t._M_impl +
                                             0x28),(string *)psVar4);
                                  pSVar6 = PrimSpec::specifier(primspec);
                                  typed_prim_14.super_NonboundableLight.name.field_2._8_4_ = *pSVar6
                                  ;
                                  tinyusdz::value::Value::Value<tinyusdz::DomeLight>
                                            ((Value *)&prim_14._variantSets._M_t._M_impl.
                                                       super__Rb_tree_header._M_node_count,
                                             (DomeLight *)auStack_28008);
                                  psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                  Prim::Prim((Prim *)auStack_28518,psVar4,
                                             (Value *)&prim_14._variantSets._M_t._M_impl.
                                                       super__Rb_tree_header._M_node_count);
                                  psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                  psVar7 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_28518);
                                  ::std::__cxx11::string::operator=
                                            ((string *)psVar7,(string *)psVar4);
                                  nonstd::optional_lite::optional<tinyusdz::Prim>::
                                  optional<tinyusdz::Prim,_0>
                                            (__return_storage_ptr__,(Prim *)auStack_28518);
                                  Prim::~Prim((Prim *)auStack_28518);
                                  tinyusdz::value::Value::~Value
                                            ((Value *)&prim_14._variantSets._M_t._M_impl.
                                                       super__Rb_tree_header._M_node_count);
                                }
                                else {
                                  ::std::__cxx11::ostringstream::ostringstream(aoStack_28188);
                                  poVar8 = ::std::operator<<((ostream *)aoStack_28188,"[error]");
                                  poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                  );
                                  poVar8 = ::std::operator<<(poVar8,":");
                                  poVar8 = ::std::operator<<(poVar8,"ReconstructPrimFromPrimSpec");
                                  poVar8 = ::std::operator<<(poVar8,"():");
                                  poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x49b);
                                  ::std::operator<<(poVar8," ");
                                  poVar8 = ::std::operator<<((ostream *)aoStack_28188,
                                                                                                                          
                                                  "Failed to reconstruct Prim from PrimSpec ");
                                  psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                  poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                                  poVar8 = ::std::operator<<(poVar8," elementName: ");
                                  psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                  poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                                  ::std::operator<<(poVar8,"\n");
                                  if (typed_prim._properties.
                                      super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                                      (pointer)0x0) {
                                    ::std::__cxx11::ostringstream::str();
                                    ::std::__cxx11::string::operator+=
                                              ((string *)
                                               typed_prim._properties.
                                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                               asStack_281a8);
                                    ::std::__cxx11::string::~string(asStack_281a8);
                                  }
                                  ::std::__cxx11::ostringstream::~ostringstream(aoStack_28188);
                                  nonstd::optional_lite::optional<tinyusdz::Prim>::optional
                                            (__return_storage_ptr__);
                                }
                                DomeLight::~DomeLight((DomeLight *)auStack_28008);
                              }
                              else {
                                psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                tinyusdz::value::TypeTraits<tinyusdz::CylinderLight>::
                                type_name_abi_cxx11_();
                                _Var3 = ::std::operator==(psVar4,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&typed_prim_15.radius._blocked);
                                ::std::__cxx11::string::~string
                                          ((string *)&typed_prim_15.radius._blocked);
                                if (_Var3) {
                                  CylinderLight::CylinderLight((CylinderLight *)auStack_2abb0);
                                  pTVar1 = typed_prim._properties.
                                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                  memset(&PStack_2abb1,0,1);
                                  tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions
                                            (&PStack_2abb1);
                                  bVar2 = tinyusdz::prim::ReconstructPrim<tinyusdz::CylinderLight>
                                                    (primspec,(CylinderLight *)auStack_2abb0,warn,
                                                     &pTVar1->str_,&PStack_2abb1);
                                  if (((bVar2 ^ 0xffU) & 1) == 0) {
                                    pPVar5 = PrimSpec::metas(primspec);
                                    PrimMetas::operator=
                                              ((PrimMetas *)
                                               &typed_prim_15.super_BoundableLight.props._M_t.
                                                _M_impl.super__Rb_tree_header._M_node_count,pPVar5);
                                    psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                    ::std::__cxx11::string::operator=
                                              ((string *)
                                               ((long)&typed_prim_15.super_BoundableLight.
                                                       super_Collection._instances._m._M_t._M_impl +
                                               0x28),(string *)psVar4);
                                    pSVar6 = PrimSpec::specifier(primspec);
                                    typed_prim_15.super_BoundableLight.name.field_2._8_4_ = *pSVar6;
                                    tinyusdz::value::Value::Value<tinyusdz::CylinderLight>
                                              ((Value *)&prim_15._variantSets._M_t._M_impl.
                                                         super__Rb_tree_header._M_node_count,
                                               (CylinderLight *)auStack_2abb0);
                                    psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                    Prim::Prim((Prim *)auStack_2b0c0,psVar4,
                                               (Value *)&prim_15._variantSets._M_t._M_impl.
                                                         super__Rb_tree_header._M_node_count);
                                    psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                    psVar7 = Prim::prim_type_name_abi_cxx11_((Prim *)auStack_2b0c0);
                                    ::std::__cxx11::string::operator=
                                              ((string *)psVar7,(string *)psVar4);
                                    nonstd::optional_lite::optional<tinyusdz::Prim>::
                                    optional<tinyusdz::Prim,_0>
                                              (__return_storage_ptr__,(Prim *)auStack_2b0c0);
                                    Prim::~Prim((Prim *)auStack_2b0c0);
                                    tinyusdz::value::Value::~Value
                                              ((Value *)&prim_15._variantSets._M_t._M_impl.
                                                         super__Rb_tree_header._M_node_count);
                                  }
                                  else {
                                    ::std::__cxx11::ostringstream::ostringstream(aoStack_2ad30);
                                    poVar8 = ::std::operator<<((ostream *)aoStack_2ad30,"[error]");
                                    poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                  );
                                    poVar8 = ::std::operator<<(poVar8,":");
                                    poVar8 = ::std::operator<<(poVar8,"ReconstructPrimFromPrimSpec")
                                    ;
                                    poVar8 = ::std::operator<<(poVar8,"():");
                                    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x49c);
                                    ::std::operator<<(poVar8," ");
                                    poVar8 = ::std::operator<<((ostream *)aoStack_2ad30,
                                                                                                                              
                                                  "Failed to reconstruct Prim from PrimSpec ");
                                    psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                    poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                                    poVar8 = ::std::operator<<(poVar8," elementName: ");
                                    psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                    poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                                    ::std::operator<<(poVar8,"\n");
                                    if (typed_prim._properties.
                                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                                        (pointer)0x0) {
                                      ::std::__cxx11::ostringstream::str();
                                      ::std::__cxx11::string::operator+=
                                                ((string *)
                                                 typed_prim._properties.
                                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                                 asStack_2ad50);
                                      ::std::__cxx11::string::~string(asStack_2ad50);
                                    }
                                    ::std::__cxx11::ostringstream::~ostringstream(aoStack_2ad30);
                                    nonstd::optional_lite::optional<tinyusdz::Prim>::optional
                                              (__return_storage_ptr__);
                                  }
                                  CylinderLight::~CylinderLight((CylinderLight *)auStack_2abb0);
                                }
                                else {
                                  psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                  tinyusdz::value::TypeTraits<tinyusdz::DiskLight>::
                                  type_name_abi_cxx11_();
                                  _Var3 = ::std::operator==(psVar4,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&typed_prim_16.radius._blocked);
                                  ::std::__cxx11::string::~string
                                            ((string *)&typed_prim_16.radius._blocked);
                                  if (_Var3) {
                                    DiskLight::DiskLight((DiskLight *)auStack_2d4d0);
                                    pTVar1 = typed_prim._properties.
                                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                    memset(&PStack_2d4d1,0,1);
                                    tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions
                                              (&PStack_2d4d1);
                                    bVar2 = tinyusdz::prim::ReconstructPrim<tinyusdz::DiskLight>
                                                      (primspec,(DiskLight *)auStack_2d4d0,warn,
                                                       &pTVar1->str_,&PStack_2d4d1);
                                    if (((bVar2 ^ 0xffU) & 1) == 0) {
                                      pPVar5 = PrimSpec::metas(primspec);
                                      PrimMetas::operator=
                                                ((PrimMetas *)
                                                 &typed_prim_16.super_BoundableLight.props._M_t.
                                                  _M_impl.super__Rb_tree_header._M_node_count,pPVar5
                                                );
                                      psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                      ::std::__cxx11::string::operator=
                                                ((string *)
                                                 ((long)&typed_prim_16.super_BoundableLight.
                                                         super_Collection._instances._m._M_t._M_impl
                                                 + 0x28),(string *)psVar4);
                                      pSVar6 = PrimSpec::specifier(primspec);
                                      typed_prim_16.super_BoundableLight.name.field_2._8_4_ =
                                           *pSVar6;
                                      tinyusdz::value::Value::Value<tinyusdz::DiskLight>
                                                ((Value *)&prim_16._variantSets._M_t._M_impl.
                                                           super__Rb_tree_header._M_node_count,
                                                 (DiskLight *)auStack_2d4d0);
                                      psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                      Prim::Prim((Prim *)auStack_2d9e0,psVar4,
                                                 (Value *)&prim_16._variantSets._M_t._M_impl.
                                                           super__Rb_tree_header._M_node_count);
                                      psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                      psVar7 = Prim::prim_type_name_abi_cxx11_
                                                         ((Prim *)auStack_2d9e0);
                                      ::std::__cxx11::string::operator=
                                                ((string *)psVar7,(string *)psVar4);
                                      nonstd::optional_lite::optional<tinyusdz::Prim>::
                                      optional<tinyusdz::Prim,_0>
                                                (__return_storage_ptr__,(Prim *)auStack_2d9e0);
                                      Prim::~Prim((Prim *)auStack_2d9e0);
                                      tinyusdz::value::Value::~Value
                                                ((Value *)&prim_16._variantSets._M_t._M_impl.
                                                           super__Rb_tree_header._M_node_count);
                                    }
                                    else {
                                      ::std::__cxx11::ostringstream::ostringstream(aoStack_2d650);
                                      poVar8 = ::std::operator<<((ostream *)aoStack_2d650,"[error]")
                                      ;
                                      poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                  );
                                      poVar8 = ::std::operator<<(poVar8,":");
                                      poVar8 = ::std::operator<<(poVar8,
                                                  "ReconstructPrimFromPrimSpec");
                                      poVar8 = ::std::operator<<(poVar8,"():");
                                      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x49d);
                                      ::std::operator<<(poVar8," ");
                                      poVar8 = ::std::operator<<((ostream *)aoStack_2d650,
                                                                                                                                  
                                                  "Failed to reconstruct Prim from PrimSpec ");
                                      psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                      poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                                      poVar8 = ::std::operator<<(poVar8," elementName: ");
                                      psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                      poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                                      ::std::operator<<(poVar8,"\n");
                                      if (typed_prim._properties.
                                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                                          (pointer)0x0) {
                                        ::std::__cxx11::ostringstream::str();
                                        ::std::__cxx11::string::operator+=
                                                  ((string *)
                                                   typed_prim._properties.
                                                                                                      
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,asStack_2d670);
                                        ::std::__cxx11::string::~string(asStack_2d670);
                                      }
                                      ::std::__cxx11::ostringstream::~ostringstream(aoStack_2d650);
                                      nonstd::optional_lite::optional<tinyusdz::Prim>::optional
                                                (__return_storage_ptr__);
                                    }
                                    DiskLight::~DiskLight((DiskLight *)auStack_2d4d0);
                                  }
                                  else {
                                    psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                    tinyusdz::value::TypeTraits<tinyusdz::DistantLight>::
                                    type_name_abi_cxx11_();
                                    _Var3 = ::std::operator==(psVar4,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&typed_prim_17.angle._blocked);
                                    ::std::__cxx11::string::~string
                                              ((string *)&typed_prim_17.angle._blocked);
                                    if (_Var3) {
                                      DistantLight::DistantLight((DistantLight *)auStack_2fb78);
                                      pTVar1 = typed_prim._properties.
                                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                      memset(&PStack_2fb79,0,1);
                                      tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions
                                                (&PStack_2fb79);
                                      bVar2 = tinyusdz::prim::
                                              ReconstructPrim<tinyusdz::DistantLight>
                                                        (primspec,(DistantLight *)auStack_2fb78,warn
                                                         ,&pTVar1->str_,&PStack_2fb79);
                                      if (((bVar2 ^ 0xffU) & 1) == 0) {
                                        pPVar5 = PrimSpec::metas(primspec);
                                        PrimMetas::operator=
                                                  ((PrimMetas *)
                                                   &typed_prim_17.super_NonboundableLight.props._M_t
                                                    ._M_impl.super__Rb_tree_header._M_node_count,
                                                   pPVar5);
                                        psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                        ::std::__cxx11::string::operator=
                                                  ((string *)
                                                   ((long)&typed_prim_17.super_NonboundableLight.
                                                           super_Collection._instances._m._M_t.
                                                           _M_impl + 0x28),(string *)psVar4);
                                        pSVar6 = PrimSpec::specifier(primspec);
                                        typed_prim_17.super_NonboundableLight.name.field_2._8_4_ =
                                             *pSVar6;
                                        tinyusdz::value::Value::Value<tinyusdz::DistantLight>
                                                  ((Value *)&prim_17._variantSets._M_t._M_impl.
                                                             super__Rb_tree_header._M_node_count,
                                                   (DistantLight *)auStack_2fb78);
                                        psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                        Prim::Prim((Prim *)auStack_30088,psVar4,
                                                   (Value *)&prim_17._variantSets._M_t._M_impl.
                                                             super__Rb_tree_header._M_node_count);
                                        psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                        psVar7 = Prim::prim_type_name_abi_cxx11_
                                                           ((Prim *)auStack_30088);
                                        ::std::__cxx11::string::operator=
                                                  ((string *)psVar7,(string *)psVar4);
                                        nonstd::optional_lite::optional<tinyusdz::Prim>::
                                        optional<tinyusdz::Prim,_0>
                                                  (__return_storage_ptr__,(Prim *)auStack_30088);
                                        Prim::~Prim((Prim *)auStack_30088);
                                        tinyusdz::value::Value::~Value
                                                  ((Value *)&prim_17._variantSets._M_t._M_impl.
                                                             super__Rb_tree_header._M_node_count);
                                      }
                                      else {
                                        ::std::__cxx11::ostringstream::ostringstream(aoStack_2fcf8);
                                        poVar8 = ::std::operator<<((ostream *)aoStack_2fcf8,
                                                                   "[error]");
                                        poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                  );
                                        poVar8 = ::std::operator<<(poVar8,":");
                                        poVar8 = ::std::operator<<(poVar8,
                                                  "ReconstructPrimFromPrimSpec");
                                        poVar8 = ::std::operator<<(poVar8,"():");
                                        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x49e)
                                        ;
                                        ::std::operator<<(poVar8," ");
                                        poVar8 = ::std::operator<<((ostream *)aoStack_2fcf8,
                                                                                                                                      
                                                  "Failed to reconstruct Prim from PrimSpec ");
                                        psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                        poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                                        poVar8 = ::std::operator<<(poVar8," elementName: ");
                                        psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                        poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                                        ::std::operator<<(poVar8,"\n");
                                        if (typed_prim._properties.
                                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                                            (pointer)0x0) {
                                          ::std::__cxx11::ostringstream::str();
                                          ::std::__cxx11::string::operator+=
                                                    ((string *)
                                                     typed_prim._properties.
                                                                                                          
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,asStack_2fd18);
                                          ::std::__cxx11::string::~string(asStack_2fd18);
                                        }
                                        ::std::__cxx11::ostringstream::~ostringstream(aoStack_2fcf8)
                                        ;
                                        nonstd::optional_lite::optional<tinyusdz::Prim>::optional
                                                  (__return_storage_ptr__);
                                      }
                                      DistantLight::~DistantLight((DistantLight *)auStack_2fb78);
                                    }
                                    else {
                                      psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                      tinyusdz::value::TypeTraits<tinyusdz::SkelRoot>::
                                      type_name_abi_cxx11_();
                                      _Var3 = ::std::operator==(psVar4,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&typed_prim_18._properties.
                                                                                                          
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                      ::std::__cxx11::string::~string
                                                ((string *)
                                                 &typed_prim_18._properties.
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                );
                                      if (_Var3) {
                                        SkelRoot::SkelRoot((SkelRoot *)auStack_31088);
                                        pTVar1 = typed_prim._properties.
                                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                        memset(&PStack_31089,0,1);
                                        tinyusdz::prim::PrimReconstructOptions::
                                        PrimReconstructOptions(&PStack_31089);
                                        bVar2 = tinyusdz::prim::ReconstructPrim<tinyusdz::SkelRoot>
                                                          (primspec,(SkelRoot *)auStack_31088,warn,
                                                           &pTVar1->str_,&PStack_31089);
                                        if (((bVar2 ^ 0xffU) & 1) == 0) {
                                          pPVar5 = PrimSpec::metas(primspec);
                                          PrimMetas::operator=
                                                    ((PrimMetas *)
                                                     &typed_prim_18.props._M_t._M_impl.
                                                      super__Rb_tree_header._M_node_count,pPVar5);
                                          psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                          ::std::__cxx11::string::operator=
                                                    ((string *)
                                                     (typed_prim_18.super_Xformable._matrix.m[3] + 3
                                                     ),(string *)psVar4);
                                          pSVar6 = PrimSpec::specifier(primspec);
                                          typed_prim_18.name.field_2._8_4_ = *pSVar6;
                                          tinyusdz::value::Value::Value<tinyusdz::SkelRoot>
                                                    ((Value *)&prim_18._variantSets._M_t._M_impl.
                                                               super__Rb_tree_header._M_node_count,
                                                     (SkelRoot *)auStack_31088);
                                          psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                          Prim::Prim((Prim *)auStack_31598,psVar4,
                                                     (Value *)&prim_18._variantSets._M_t._M_impl.
                                                               super__Rb_tree_header._M_node_count);
                                          psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                          psVar7 = Prim::prim_type_name_abi_cxx11_
                                                             ((Prim *)auStack_31598);
                                          ::std::__cxx11::string::operator=
                                                    ((string *)psVar7,(string *)psVar4);
                                          nonstd::optional_lite::optional<tinyusdz::Prim>::
                                          optional<tinyusdz::Prim,_0>
                                                    (__return_storage_ptr__,(Prim *)auStack_31598);
                                          Prim::~Prim((Prim *)auStack_31598);
                                          tinyusdz::value::Value::~Value
                                                    ((Value *)&prim_18._variantSets._M_t._M_impl.
                                                               super__Rb_tree_header._M_node_count);
                                        }
                                        else {
                                          ::std::__cxx11::ostringstream::ostringstream
                                                    (aoStack_31208);
                                          poVar8 = ::std::operator<<((ostream *)aoStack_31208,
                                                                     "[error]");
                                          poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                  );
                                          poVar8 = ::std::operator<<(poVar8,":");
                                          poVar8 = ::std::operator<<(poVar8,
                                                  "ReconstructPrimFromPrimSpec");
                                          poVar8 = ::std::operator<<(poVar8,"():");
                                          poVar8 = (ostream *)
                                                   ::std::ostream::operator<<(poVar8,0x49f);
                                          ::std::operator<<(poVar8," ");
                                          poVar8 = ::std::operator<<((ostream *)aoStack_31208,
                                                                                                                                          
                                                  "Failed to reconstruct Prim from PrimSpec ");
                                          psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                          poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                                          poVar8 = ::std::operator<<(poVar8," elementName: ");
                                          psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                          poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                                          ::std::operator<<(poVar8,"\n");
                                          if (typed_prim._properties.
                                              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                                              (pointer)0x0) {
                                            ::std::__cxx11::ostringstream::str();
                                            ::std::__cxx11::string::operator+=
                                                      ((string *)
                                                       typed_prim._properties.
                                                                                                              
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,asStack_31228);
                                            ::std::__cxx11::string::~string(asStack_31228);
                                          }
                                          ::std::__cxx11::ostringstream::~ostringstream
                                                    (aoStack_31208);
                                          nonstd::optional_lite::optional<tinyusdz::Prim>::optional
                                                    (__return_storage_ptr__);
                                        }
                                        SkelRoot::~SkelRoot((SkelRoot *)auStack_31088);
                                      }
                                      else {
                                        psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                        tinyusdz::value::TypeTraits<tinyusdz::Skeleton>::
                                        type_name_abi_cxx11_();
                                        _Var3 = ::std::operator==(psVar4,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&typed_prim_19._properties.
                                                                                                          
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                        ::std::__cxx11::string::~string
                                                  ((string *)
                                                   &typed_prim_19._properties.
                                                                                                        
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                        if (_Var3) {
                                          Skeleton::Skeleton((Skeleton *)auStack_331e8);
                                          pTVar1 = typed_prim._properties.
                                                                                                      
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          ;
                                          memset(&PStack_331e9,0,1);
                                          tinyusdz::prim::PrimReconstructOptions::
                                          PrimReconstructOptions(&PStack_331e9);
                                          bVar2 = tinyusdz::prim::
                                                  ReconstructPrim<tinyusdz::Skeleton>
                                                            (primspec,(Skeleton *)auStack_331e8,warn
                                                             ,&pTVar1->str_,&PStack_331e9);
                                          if (((bVar2 ^ 0xffU) & 1) == 0) {
                                            pPVar5 = PrimSpec::metas(primspec);
                                            PrimMetas::operator=
                                                      ((PrimMetas *)
                                                       &typed_prim_19.props._M_t._M_impl.
                                                        super__Rb_tree_header._M_node_count,pPVar5);
                                            psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                            ::std::__cxx11::string::operator=
                                                      ((string *)
                                                       (typed_prim_19.super_Xformable._matrix.m[3] +
                                                       3),(string *)psVar4);
                                            pSVar6 = PrimSpec::specifier(primspec);
                                            typed_prim_19.name.field_2._8_4_ = *pSVar6;
                                            tinyusdz::value::Value::Value<tinyusdz::Skeleton>
                                                      ((Value *)&prim_19._variantSets._M_t._M_impl.
                                                                 super__Rb_tree_header._M_node_count
                                                       ,(Skeleton *)auStack_331e8);
                                            psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                            Prim::Prim((Prim *)auStack_336f8,psVar4,
                                                       (Value *)&prim_19._variantSets._M_t._M_impl.
                                                                 super__Rb_tree_header._M_node_count
                                                      );
                                            psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                            psVar7 = Prim::prim_type_name_abi_cxx11_
                                                               ((Prim *)auStack_336f8);
                                            ::std::__cxx11::string::operator=
                                                      ((string *)psVar7,(string *)psVar4);
                                            nonstd::optional_lite::optional<tinyusdz::Prim>::
                                            optional<tinyusdz::Prim,_0>
                                                      (__return_storage_ptr__,(Prim *)auStack_336f8)
                                            ;
                                            Prim::~Prim((Prim *)auStack_336f8);
                                            tinyusdz::value::Value::~Value
                                                      ((Value *)&prim_19._variantSets._M_t._M_impl.
                                                                 super__Rb_tree_header._M_node_count
                                                      );
                                          }
                                          else {
                                            ::std::__cxx11::ostringstream::ostringstream
                                                      (aoStack_33368);
                                            poVar8 = ::std::operator<<((ostream *)aoStack_33368,
                                                                       "[error]");
                                            poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                  );
                                            poVar8 = ::std::operator<<(poVar8,":");
                                            poVar8 = ::std::operator<<(poVar8,
                                                  "ReconstructPrimFromPrimSpec");
                                            poVar8 = ::std::operator<<(poVar8,"():");
                                            poVar8 = (ostream *)
                                                     ::std::ostream::operator<<(poVar8,0x4a0);
                                            ::std::operator<<(poVar8," ");
                                            poVar8 = ::std::operator<<((ostream *)aoStack_33368,
                                                                                                                                              
                                                  "Failed to reconstruct Prim from PrimSpec ");
                                            psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                            poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                                            poVar8 = ::std::operator<<(poVar8," elementName: ");
                                            psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                            poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                                            ::std::operator<<(poVar8,"\n");
                                            if (typed_prim._properties.
                                                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                != (pointer)0x0) {
                                              ::std::__cxx11::ostringstream::str();
                                              ::std::__cxx11::string::operator+=
                                                        ((string *)
                                                         typed_prim._properties.
                                                                                                                  
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,asStack_33388);
                                              ::std::__cxx11::string::~string(asStack_33388);
                                            }
                                            ::std::__cxx11::ostringstream::~ostringstream
                                                      (aoStack_33368);
                                            nonstd::optional_lite::optional<tinyusdz::Prim>::
                                            optional(__return_storage_ptr__);
                                          }
                                          Skeleton::~Skeleton((Skeleton *)auStack_331e8);
                                        }
                                        else {
                                          psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                          tinyusdz::value::TypeTraits<tinyusdz::SkelAnimation>::
                                          type_name_abi_cxx11_();
                                          _Var3 = ::std::operator==(psVar4,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&typed_prim_20._properties.
                                                                                                          
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                          ::std::__cxx11::string::~string
                                                    ((string *)
                                                     &typed_prim_20._properties.
                                                                                                            
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                          if (_Var3) {
                                            SkelAnimation::SkelAnimation
                                                      ((SkelAnimation *)auStack_34a90);
                                            pTVar1 = typed_prim._properties.
                                                                                                          
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            ;
                                            memset(&PStack_34a91,0,1);
                                            tinyusdz::prim::PrimReconstructOptions::
                                            PrimReconstructOptions(&PStack_34a91);
                                            bVar2 = tinyusdz::prim::
                                                    ReconstructPrim<tinyusdz::SkelAnimation>
                                                              (primspec,(SkelAnimation *)
                                                                        auStack_34a90,warn,
                                                               &pTVar1->str_,&PStack_34a91);
                                            if (((bVar2 ^ 0xffU) & 1) == 0) {
                                              pPVar5 = PrimSpec::metas(primspec);
                                              PrimMetas::operator=
                                                        ((PrimMetas *)
                                                         &typed_prim_20.props._M_t._M_impl.
                                                          super__Rb_tree_header._M_node_count,pPVar5
                                                        );
                                              psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                              ::std::__cxx11::string::operator=
                                                        ((string *)auStack_34a90,(string *)psVar4);
                                              pSVar6 = PrimSpec::specifier(primspec);
                                              typed_prim_20.name.field_2._8_4_ = *pSVar6;
                                              tinyusdz::value::Value::Value<tinyusdz::SkelAnimation>
                                                        ((Value *)&prim_20._variantSets._M_t._M_impl
                                                                   .super__Rb_tree_header.
                                                                   _M_node_count,
                                                         (SkelAnimation *)auStack_34a90);
                                              psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                              Prim::Prim((Prim *)auStack_34fa0,psVar4,
                                                         (Value *)&prim_20._variantSets._M_t._M_impl
                                                                   .super__Rb_tree_header.
                                                                   _M_node_count);
                                              psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                              psVar7 = Prim::prim_type_name_abi_cxx11_
                                                                 ((Prim *)auStack_34fa0);
                                              ::std::__cxx11::string::operator=
                                                        ((string *)psVar7,(string *)psVar4);
                                              nonstd::optional_lite::optional<tinyusdz::Prim>::
                                              optional<tinyusdz::Prim,_0>
                                                        (__return_storage_ptr__,
                                                         (Prim *)auStack_34fa0);
                                              Prim::~Prim((Prim *)auStack_34fa0);
                                              tinyusdz::value::Value::~Value
                                                        ((Value *)&prim_20._variantSets._M_t._M_impl
                                                                   .super__Rb_tree_header.
                                                                   _M_node_count);
                                            }
                                            else {
                                              ::std::__cxx11::ostringstream::ostringstream
                                                        (aoStack_34c10);
                                              poVar8 = ::std::operator<<((ostream *)aoStack_34c10,
                                                                         "[error]");
                                              poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                  );
                                              poVar8 = ::std::operator<<(poVar8,":");
                                              poVar8 = ::std::operator<<(poVar8,
                                                  "ReconstructPrimFromPrimSpec");
                                              poVar8 = ::std::operator<<(poVar8,"():");
                                              poVar8 = (ostream *)
                                                       ::std::ostream::operator<<(poVar8,0x4a1);
                                              ::std::operator<<(poVar8," ");
                                              poVar8 = ::std::operator<<((ostream *)aoStack_34c10,
                                                                                                                                                  
                                                  "Failed to reconstruct Prim from PrimSpec ");
                                              psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                              poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                                              poVar8 = ::std::operator<<(poVar8," elementName: ");
                                              psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                              poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                                              ::std::operator<<(poVar8,"\n");
                                              if (typed_prim._properties.
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0) {
                                                ::std::__cxx11::ostringstream::str();
                                                ::std::__cxx11::string::operator+=
                                                          ((string *)
                                                           typed_prim._properties.
                                                                                                                      
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,asStack_34c30);
                                                ::std::__cxx11::string::~string(asStack_34c30);
                                              }
                                              ::std::__cxx11::ostringstream::~ostringstream
                                                        (aoStack_34c10);
                                              nonstd::optional_lite::optional<tinyusdz::Prim>::
                                              optional(__return_storage_ptr__);
                                            }
                                            SkelAnimation::~SkelAnimation
                                                      ((SkelAnimation *)auStack_34a90);
                                          }
                                          else {
                                            psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                            tinyusdz::value::TypeTraits<tinyusdz::BlendShape>::
                                            type_name_abi_cxx11_();
                                            _Var3 = ::std::operator==(psVar4,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&typed_prim_21._properties.
                                                                                                          
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                            ::std::__cxx11::string::~string
                                                      ((string *)
                                                       &typed_prim_21._properties.
                                                                                                                
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                            if (_Var3) {
                                              BlendShape::BlendShape((BlendShape *)auStack_35ba8);
                                              pTVar1 = typed_prim._properties.
                                                                                                              
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              ;
                                              memset(&PStack_35ba9,0,1);
                                              tinyusdz::prim::PrimReconstructOptions::
                                              PrimReconstructOptions(&PStack_35ba9);
                                              bVar2 = tinyusdz::prim::
                                                      ReconstructPrim<tinyusdz::BlendShape>
                                                                (primspec,(BlendShape *)
                                                                          auStack_35ba8,warn,
                                                                 &pTVar1->str_,&PStack_35ba9);
                                              if (((bVar2 ^ 0xffU) & 1) == 0) {
                                                pPVar5 = PrimSpec::metas(primspec);
                                                PrimMetas::operator=
                                                          ((PrimMetas *)
                                                           &typed_prim_21.props._M_t._M_impl.
                                                            super__Rb_tree_header._M_node_count,
                                                           pPVar5);
                                                psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                                ::std::__cxx11::string::operator=
                                                          ((string *)auStack_35ba8,(string *)psVar4)
                                                ;
                                                pSVar6 = PrimSpec::specifier(primspec);
                                                typed_prim_21.name.field_2._8_4_ = *pSVar6;
                                                tinyusdz::value::Value::Value<tinyusdz::BlendShape>
                                                          ((Value *)&prim_21._variantSets._M_t.
                                                                     _M_impl.super__Rb_tree_header.
                                                                     _M_node_count,
                                                           (BlendShape *)auStack_35ba8);
                                                psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                                Prim::Prim((Prim *)auStack_360b8,psVar4,
                                                           (Value *)&prim_21._variantSets._M_t.
                                                                     _M_impl.super__Rb_tree_header.
                                                                     _M_node_count);
                                                psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                                psVar7 = Prim::prim_type_name_abi_cxx11_
                                                                   ((Prim *)auStack_360b8);
                                                ::std::__cxx11::string::operator=
                                                          ((string *)psVar7,(string *)psVar4);
                                                nonstd::optional_lite::optional<tinyusdz::Prim>::
                                                optional<tinyusdz::Prim,_0>
                                                          (__return_storage_ptr__,
                                                           (Prim *)auStack_360b8);
                                                Prim::~Prim((Prim *)auStack_360b8);
                                                tinyusdz::value::Value::~Value
                                                          ((Value *)&prim_21._variantSets._M_t.
                                                                     _M_impl.super__Rb_tree_header.
                                                                     _M_node_count);
                                              }
                                              else {
                                                ::std::__cxx11::ostringstream::ostringstream
                                                          (aoStack_35d28);
                                                poVar8 = ::std::operator<<((ostream *)aoStack_35d28,
                                                                           "[error]");
                                                poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                  );
                                                poVar8 = ::std::operator<<(poVar8,":");
                                                poVar8 = ::std::operator<<(poVar8,
                                                  "ReconstructPrimFromPrimSpec");
                                                poVar8 = ::std::operator<<(poVar8,"():");
                                                poVar8 = (ostream *)
                                                         ::std::ostream::operator<<(poVar8,0x4a2);
                                                ::std::operator<<(poVar8," ");
                                                poVar8 = ::std::operator<<((ostream *)aoStack_35d28,
                                                                                                                                                      
                                                  "Failed to reconstruct Prim from PrimSpec ");
                                                psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                                poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                                                poVar8 = ::std::operator<<(poVar8," elementName: ");
                                                psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                                poVar8 = ::std::operator<<(poVar8,(string *)psVar4);
                                                ::std::operator<<(poVar8,"\n");
                                                if (typed_prim._properties.
                                                                                                        
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0) {
                                                  ::std::__cxx11::ostringstream::str();
                                                  ::std::__cxx11::string::operator+=
                                                            ((string *)
                                                             typed_prim._properties.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,asStack_35d48);
                                                  ::std::__cxx11::string::~string(asStack_35d48);
                                                }
                                                ::std::__cxx11::ostringstream::~ostringstream
                                                          (aoStack_35d28);
                                                nonstd::optional_lite::optional<tinyusdz::Prim>::
                                                optional(__return_storage_ptr__);
                                              }
                                              BlendShape::~BlendShape((BlendShape *)auStack_35ba8);
                                            }
                                            else {
                                              psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                              tinyusdz::value::TypeTraits<tinyusdz::Shader>::
                                              type_name_abi_cxx11_();
                                              _Var3 = ::std::operator==(psVar4,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&typed_prim_22.value.v_.vtable);
                                              ::std::__cxx11::string::~string
                                                        ((string *)&typed_prim_22.value.v_.vtable);
                                              if (_Var3) {
                                                Shader::Shader((Shader *)auStack_36840);
                                                pTVar1 = typed_prim._properties.
                                                                                                                  
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                ;
                                                memset(&PStack_36841,0,1);
                                                tinyusdz::prim::PrimReconstructOptions::
                                                PrimReconstructOptions(&PStack_36841);
                                                bVar2 = tinyusdz::prim::
                                                        ReconstructPrim<tinyusdz::Shader>
                                                                  (primspec,(Shader *)auStack_36840,
                                                                   warn,&pTVar1->str_,&PStack_36841)
                                                ;
                                                if (((bVar2 ^ 0xffU) & 1) == 0) {
                                                  pPVar5 = PrimSpec::metas(primspec);
                                                  PrimMetas::operator=
                                                            ((PrimMetas *)
                                                             &typed_prim_22.super_UsdShadePrim.
                                                              parent_id,pPVar5);
                                                  psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                                  ::std::__cxx11::string::operator=
                                                            ((string *)auStack_36840,
                                                             (string *)psVar4);
                                                  pSVar6 = PrimSpec::specifier(primspec);
                                                  typed_prim_22.super_UsdShadePrim.name.field_2.
                                                  _8_4_ = *pSVar6;
                                                  tinyusdz::value::Value::Value<tinyusdz::Shader>
                                                            ((Value *)&prim_22._variantSets._M_t.
                                                                       _M_impl.super__Rb_tree_header
                                                                       ._M_node_count,
                                                             (Shader *)auStack_36840);
                                                  psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                                  Prim::Prim((Prim *)auStack_36d50,psVar4,
                                                             (Value *)&prim_22._variantSets._M_t.
                                                                       _M_impl.super__Rb_tree_header
                                                                       ._M_node_count);
                                                  psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                                  psVar7 = Prim::prim_type_name_abi_cxx11_
                                                                     ((Prim *)auStack_36d50);
                                                  ::std::__cxx11::string::operator=
                                                            ((string *)psVar7,(string *)psVar4);
                                                  nonstd::optional_lite::optional<tinyusdz::Prim>::
                                                  optional<tinyusdz::Prim,_0>
                                                            (__return_storage_ptr__,
                                                             (Prim *)auStack_36d50);
                                                  Prim::~Prim((Prim *)auStack_36d50);
                                                  tinyusdz::value::Value::~Value
                                                            ((Value *)&prim_22._variantSets._M_t.
                                                                       _M_impl.super__Rb_tree_header
                                                                       ._M_node_count);
                                                }
                                                else {
                                                  ::std::__cxx11::ostringstream::ostringstream
                                                            (aoStack_369c0);
                                                  poVar8 = ::std::operator<<((ostream *)
                                                                             aoStack_369c0,"[error]"
                                                                            );
                                                  poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                  );
                                                  poVar8 = ::std::operator<<(poVar8,":");
                                                  poVar8 = ::std::operator<<(poVar8,
                                                  "ReconstructPrimFromPrimSpec");
                                                  poVar8 = ::std::operator<<(poVar8,"():");
                                                  poVar8 = (ostream *)
                                                           ::std::ostream::operator<<(poVar8,0x4a3);
                                                  ::std::operator<<(poVar8," ");
                                                  poVar8 = ::std::operator<<((ostream *)
                                                                             aoStack_369c0,
                                                                                                                                                          
                                                  "Failed to reconstruct Prim from PrimSpec ");
                                                  psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                                  poVar8 = ::std::operator<<(poVar8,(string *)psVar4
                                                                            );
                                                  poVar8 = ::std::operator<<(poVar8," elementName: "
                                                                            );
                                                  psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                                  poVar8 = ::std::operator<<(poVar8,(string *)psVar4
                                                                            );
                                                  ::std::operator<<(poVar8,"\n");
                                                  if (typed_prim._properties.
                                                                                                            
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0) {
                                                    ::std::__cxx11::ostringstream::str();
                                                    ::std::__cxx11::string::operator+=
                                                              ((string *)
                                                               typed_prim._properties.
                                                                                                                              
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,asStack_369e0);
                                                  ::std::__cxx11::string::~string(asStack_369e0);
                                                  }
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (aoStack_369c0);
                                                  nonstd::optional_lite::optional<tinyusdz::Prim>::
                                                  optional(__return_storage_ptr__);
                                                }
                                                Shader::~Shader((Shader *)auStack_36840);
                                              }
                                              else {
                                                psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                                tinyusdz::value::TypeTraits<tinyusdz::Material>::
                                                type_name_abi_cxx11_();
                                                _Var3 = ::std::operator==(psVar4,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&typed_prim_23.volume._listOpQual);
                                                ::std::__cxx11::string::~string
                                                          ((string *)
                                                           &typed_prim_23.volume._listOpQual);
                                                if (_Var3) {
                                                  Material::Material((Material *)auStack_37b30);
                                                  pTVar1 = typed_prim._properties.
                                                                                                                      
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  memset(&PStack_37b31,0,1);
                                                  tinyusdz::prim::PrimReconstructOptions::
                                                  PrimReconstructOptions(&PStack_37b31);
                                                  bVar2 = tinyusdz::prim::
                                                          ReconstructPrim<tinyusdz::Material>
                                                                    (primspec,(Material *)
                                                                              auStack_37b30,warn,
                                                                     &pTVar1->str_,&PStack_37b31);
                                                  if (((bVar2 ^ 0xffU) & 1) == 0) {
                                                    pPVar5 = PrimSpec::metas(primspec);
                                                    PrimMetas::operator=
                                                              ((PrimMetas *)
                                                               &typed_prim_23.super_UsdShadePrim.
                                                                parent_id,pPVar5);
                                                    psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                                    ::std::__cxx11::string::operator=
                                                              ((string *)auStack_37b30,
                                                               (string *)psVar4);
                                                    pSVar6 = PrimSpec::specifier(primspec);
                                                    typed_prim_23.super_UsdShadePrim.name.field_2.
                                                    _8_4_ = *pSVar6;
                                                    tinyusdz::value::Value::
                                                    Value<tinyusdz::Material>
                                                              ((Value *)&prim_23._variantSets._M_t.
                                                                         _M_impl.
                                                  super__Rb_tree_header._M_node_count,
                                                  (Material *)auStack_37b30);
                                                  psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                                  Prim::Prim((Prim *)auStack_38040,psVar4,
                                                             (Value *)&prim_23._variantSets._M_t.
                                                                       _M_impl.super__Rb_tree_header
                                                                       ._M_node_count);
                                                  psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                                  psVar7 = Prim::prim_type_name_abi_cxx11_
                                                                     ((Prim *)auStack_38040);
                                                  ::std::__cxx11::string::operator=
                                                            ((string *)psVar7,(string *)psVar4);
                                                  nonstd::optional_lite::optional<tinyusdz::Prim>::
                                                  optional<tinyusdz::Prim,_0>
                                                            (__return_storage_ptr__,
                                                             (Prim *)auStack_38040);
                                                  Prim::~Prim((Prim *)auStack_38040);
                                                  tinyusdz::value::Value::~Value
                                                            ((Value *)&prim_23._variantSets._M_t.
                                                                       _M_impl.super__Rb_tree_header
                                                                       ._M_node_count);
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (aoStack_37cb0);
                                                    poVar8 = ::std::operator<<((ostream *)
                                                                               aoStack_37cb0,
                                                                               "[error]");
                                                    poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                  );
                                                  poVar8 = ::std::operator<<(poVar8,":");
                                                  poVar8 = ::std::operator<<(poVar8,
                                                  "ReconstructPrimFromPrimSpec");
                                                  poVar8 = ::std::operator<<(poVar8,"():");
                                                  poVar8 = (ostream *)
                                                           ::std::ostream::operator<<(poVar8,0x4a4);
                                                  ::std::operator<<(poVar8," ");
                                                  poVar8 = ::std::operator<<((ostream *)
                                                                             aoStack_37cb0,
                                                                                                                                                          
                                                  "Failed to reconstruct Prim from PrimSpec ");
                                                  psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                                  poVar8 = ::std::operator<<(poVar8,(string *)psVar4
                                                                            );
                                                  poVar8 = ::std::operator<<(poVar8," elementName: "
                                                                            );
                                                  psVar4 = PrimSpec::name_abi_cxx11_(primspec);
                                                  poVar8 = ::std::operator<<(poVar8,(string *)psVar4
                                                                            );
                                                  ::std::operator<<(poVar8,"\n");
                                                  if (typed_prim._properties.
                                                                                                            
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0) {
                                                    ::std::__cxx11::ostringstream::str();
                                                    ::std::__cxx11::string::operator+=
                                                              ((string *)
                                                               typed_prim._properties.
                                                                                                                              
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,asStack_37cd0);
                                                  ::std::__cxx11::string::~string(asStack_37cd0);
                                                  }
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (aoStack_37cb0);
                                                  nonstd::optional_lite::optional<tinyusdz::Prim>::
                                                  optional(__return_storage_ptr__);
                                                  }
                                                  Material::~Material((Material *)auStack_37b30);
                                                }
                                                else {
                                                  ::std::__cxx11::ostringstream::ostringstream
                                                            (aoStack_381b8);
                                                  poVar8 = ::std::operator<<((ostream *)
                                                                             aoStack_381b8,"[warn]")
                                                  ;
                                                  poVar8 = ::std::operator<<(poVar8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                                  );
                                                  poVar8 = ::std::operator<<(poVar8,":");
                                                  poVar8 = ::std::operator<<(poVar8,
                                                  "ReconstructPrimFromPrimSpec");
                                                  poVar8 = ::std::operator<<(poVar8,"():");
                                                  poVar8 = (ostream *)
                                                           ::std::ostream::operator<<(poVar8,0x4a5);
                                                  ::std::operator<<(poVar8," ");
                                                  poVar8 = ::std::operator<<((ostream *)
                                                                             aoStack_381b8,
                                                                                                                                                          
                                                  "TODO or unsupported prim type: ");
                                                  psVar4 = PrimSpec::typeName_abi_cxx11_(primspec);
                                                  poVar8 = ::std::operator<<(poVar8,(string *)psVar4
                                                                            );
                                                  ::std::operator<<(poVar8,"\n");
                                                  if (warn != (string *)0x0) {
                                                    ::std::__cxx11::ostringstream::str();
                                                    ::std::__cxx11::string::operator+=
                                                              ((string *)warn,asStack_381d8);
                                                    ::std::__cxx11::string::~string(asStack_381d8);
                                                  }
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (aoStack_381b8);
                                                  nonstd::optional_lite::optional<tinyusdz::Prim>::
                                                  optional(__return_storage_ptr__);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static nonstd::optional<Prim> ReconstructPrimFromPrimSpec(
    const PrimSpec &primspec, std::string *warn, std::string *err) {
  (void)warn;

  // TODO:
  // - propertyNames()
  // - primChildrenNames()

#define RECONSTRUCT_PRIM(__primty)                                       \
  if (primspec.typeName() == value::TypeTraits<__primty>::type_name()) { \
    __primty typed_prim;                                                 \
    if (!prim::ReconstructPrim(primspec, &typed_prim, warn, err)) {      \
      PUSH_ERROR("Failed to reconstruct Prim from PrimSpec "             \
                 << primspec.typeName()                                  \
                 << " elementName: " << primspec.name());                \
      return nonstd::nullopt;                                            \
    }                                                                    \
    typed_prim.meta = primspec.metas();                                  \
    typed_prim.name = primspec.name();                                   \
    typed_prim.spec = primspec.specifier();                              \
    /*typed_prim.propertyNames() = properties; */                        \
    /*typed_prim.primChildrenNames() = primChildren;*/                   \
    value::Value primdata = typed_prim;                                  \
    Prim prim(primspec.name(), primdata);                                \
    prim.prim_type_name() = primspec.typeName();                         \
    /* also add primChildren to Prim */                                  \
    /* prim.metas().primChildren = primChildren; */                      \
    return std::move(prim);                                              \
  }